

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86::forward(InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  int iVar9;
  long lVar10;
  void *pvVar11;
  int *piVar12;
  _func_int *p_Var13;
  void *pvVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  int iVar30;
  undefined1 (*pauVar31) [16];
  float *pfVar32;
  byte bVar33;
  uint uVar34;
  ulong uVar35;
  float *pfVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  float *pfVar40;
  long lVar41;
  float *pfVar42;
  uint uVar43;
  ulong uVar44;
  undefined1 (*pauVar45) [16];
  long lVar46;
  uint uVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  float *pfVar51;
  int p_3;
  float fVar58;
  float fVar59;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar60;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  v4sf one;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar159;
  float fVar168;
  float fVar169;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar170;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar171;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  Option opt_flatten;
  long local_140;
  uint local_128;
  float *local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  int local_d0;
  Allocator *local_c8;
  int local_c0;
  int iStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  size_t local_a8;
  _func_int *local_a0;
  undefined1 local_98 [16];
  ulong local_88;
  long local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0xdc + (long)this->_vptr_InnerProduct_x86[-3]) != 0)) {
    iVar30 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar30;
  }
  local_c0 = bottom_blob->dims;
  if ((local_c0 == 2) &&
     (bottom_blob->w ==
      *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86[-3]) /
      *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]))) {
    Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]),
                bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
    iVar30 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      local_80 = (long)bottom_blob->h;
      if (0 < local_80) {
        local_a0 = this->_vptr_InnerProduct_x86[-3];
        iVar30 = *(int *)(&this->field_0xe0 + (long)local_a0);
        uVar34 = bottom_blob->w;
        uVar44 = (ulong)top_blob->w;
        bVar33 = (uVar44 & 3) == 0 & opt->use_packing_layout;
        lVar10 = *(long *)(&this->field_0x178 + (long)local_a0);
        iVar9 = bottom_blob->elempack;
        uVar43 = top_blob->w >> 2;
        local_88 = (ulong)uVar43;
        local_140 = 0;
        do {
          if ((iVar9 == 4 & bVar33 & 0 < (int)uVar43) != 0) {
            pauVar31 = (undefined1 (*) [16])
                       (top_blob->w * local_140 * top_blob->elemsize + (long)top_blob->data);
            uVar35 = 0;
            do {
              if (lVar10 == 0) {
                auVar122 = ZEXT816(0);
              }
              else {
                auVar122 = *(undefined1 (*) [16])(lVar10 + uVar35 * 0x10);
              }
              auVar61 = auVar122;
              auVar79 = auVar122;
              auVar104 = auVar122;
              if (0 < (int)uVar34) {
                lVar39 = bottom_blob->elemsize * local_140 * (long)bottom_blob->w;
                pvVar11 = bottom_blob->data;
                lVar46 = 0;
                auVar123 = auVar122;
                auVar120 = auVar122;
                auVar167 = auVar122;
                auVar98 = auVar122;
                uVar47 = uVar34;
                do {
                  auVar106._0_4_ = *(float *)((long)pvVar11 + lVar46 + lVar39);
                  fVar58 = *(float *)((long)pvVar11 + lVar46 + lVar39 + 4);
                  fVar59 = *(float *)((long)pvVar11 + lVar46 + lVar39 + 8);
                  fVar60 = *(float *)((long)pvVar11 + lVar46 + lVar39 + 0xc);
                  pfVar40 = (float *)((long)(this->weight_data_tm).data +
                                     lVar46 + (this->weight_data_tm).elemsize * uVar35 *
                                              (long)(this->weight_data_tm).w);
                  fVar171 = *pfVar40;
                  fVar175 = pfVar40[1];
                  fVar176 = pfVar40[2];
                  fVar177 = pfVar40[3];
                  auVar122._0_4_ = auVar123._0_4_ + auVar106._0_4_ * fVar171;
                  auVar122._4_4_ = auVar123._4_4_ + auVar106._0_4_ * fVar175;
                  auVar122._8_4_ = auVar123._8_4_ + auVar106._0_4_ * fVar176;
                  auVar122._12_4_ = auVar123._12_4_ + auVar106._0_4_ * fVar177;
                  auVar104._0_4_ = auVar98._0_4_ + fVar58 * fVar171;
                  auVar104._4_4_ = auVar98._4_4_ + fVar58 * fVar175;
                  auVar104._8_4_ = auVar98._8_4_ + fVar58 * fVar176;
                  auVar104._12_4_ = auVar98._12_4_ + fVar58 * fVar177;
                  auVar61._0_4_ = auVar120._0_4_ + fVar59 * fVar171;
                  auVar61._4_4_ = auVar120._4_4_ + fVar59 * fVar175;
                  auVar61._8_4_ = auVar120._8_4_ + fVar59 * fVar176;
                  auVar61._12_4_ = auVar120._12_4_ + fVar59 * fVar177;
                  auVar79._0_4_ = auVar167._0_4_ + fVar60 * fVar171;
                  auVar79._4_4_ = auVar167._4_4_ + fVar60 * fVar175;
                  auVar79._8_4_ = auVar167._8_4_ + fVar60 * fVar176;
                  auVar79._12_4_ = auVar167._12_4_ + fVar60 * fVar177;
                  lVar46 = lVar46 + 0x10;
                  uVar47 = uVar47 - 1;
                  auVar123 = auVar122;
                  auVar120 = auVar61;
                  auVar167 = auVar79;
                  auVar98 = auVar104;
                } while (uVar47 != 0);
              }
              iVar38 = iVar30 + -1;
              auVar106._0_4_ = auVar122._0_4_;
              fVar58 = auVar122._4_4_;
              fVar59 = auVar122._8_4_;
              fVar60 = auVar122._12_4_;
              switch(iVar38) {
              case 0:
                auVar122 = maxps(auVar122,_DAT_00592030);
                break;
              case 1:
                auVar120 = maxps(auVar122,ZEXT816(0));
                auVar123 = minps(auVar122,ZEXT816(0));
                auVar106._0_4_ = **(float **)(&this->field_0xe8 + (long)local_a0);
                auVar122._4_4_ = auVar106._0_4_ * auVar123._4_4_ + auVar120._4_4_;
                auVar122._0_4_ = auVar106._0_4_ * auVar123._0_4_ + auVar120._0_4_;
                auVar122._8_4_ = auVar106._0_4_ * auVar123._8_4_ + auVar120._8_4_;
                auVar122._12_4_ = auVar106._0_4_ * auVar123._12_4_ + auVar120._12_4_;
                break;
              case 2:
                uVar6 = **(undefined4 **)(&this->field_0xe8 + (long)local_a0);
                uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)local_a0))[1];
                auVar118._4_4_ = uVar6;
                auVar118._0_4_ = uVar6;
                auVar118._8_4_ = uVar6;
                auVar118._12_4_ = uVar6;
                auVar143._4_4_ = uVar5;
                auVar143._0_4_ = uVar5;
                auVar143._8_4_ = uVar5;
                auVar143._12_4_ = uVar5;
                auVar122 = maxps(auVar122,auVar118);
                auVar122 = minps(auVar122,auVar143);
                break;
              case 3:
                auVar52._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
                auVar52._8_4_ = -fVar59;
                auVar52._12_4_ = -fVar60;
                auVar122 = minps(auVar52,_DAT_00595260);
                auVar122 = maxps(auVar122,_DAT_00595270);
                fVar58 = auVar122._0_4_ * 1.442695 + 0.5;
                fVar60 = auVar122._4_4_ * 1.442695 + 0.5;
                fVar175 = auVar122._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar122._12_4_ * 1.442695 + 0.5;
                auVar106._0_4_ = (float)(int)fVar58;
                fVar59 = (float)(int)fVar60;
                fVar171 = (float)(int)fVar175;
                fVar176 = (float)(int)fVar177;
                auVar106._0_4_ =
                     auVar106._0_4_ - (float)(-(uint)(fVar58 < auVar106._0_4_) & 0x3f800000);
                fVar59 = fVar59 - (float)(-(uint)(fVar60 < fVar59) & 0x3f800000);
                fVar171 = fVar171 - (float)(-(uint)(fVar175 < fVar171) & 0x3f800000);
                fVar176 = fVar176 - (float)(-(uint)(fVar177 < fVar176) & 0x3f800000);
                fVar58 = auVar106._0_4_ * -0.6931472 + auVar122._0_4_;
                fVar60 = fVar59 * -0.6931472 + auVar122._4_4_;
                fVar175 = fVar171 * -0.6931472 + auVar122._8_4_;
                fVar177 = fVar176 * -0.6931472 + auVar122._12_4_;
                auVar119._0_4_ =
                     fVar58 + 1.0 +
                     (((((fVar58 * 0.00019875691 + 0.0013981999) * fVar58 + 0.008333452) * fVar58 +
                       0.041665796) * fVar58 + 0.16666666) * fVar58 + 0.5) * fVar58 * fVar58;
                auVar119._4_4_ =
                     fVar60 + 1.0 +
                     (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                       0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60;
                auVar119._8_4_ =
                     fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
                auVar119._12_4_ =
                     fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
                auVar144._0_4_ =
                     (float)((int)auVar106._0_4_ * 0x800000 + 0x3f800000) * auVar119._0_4_ + 1.0;
                auVar144._4_4_ = (float)((int)fVar59 * 0x800000 + 0x3f800000) * auVar119._4_4_ + 1.0
                ;
                auVar144._8_4_ =
                     (float)((int)fVar171 * 0x800000 + 0x3f800000) * auVar119._8_4_ + 1.0;
                auVar144._12_4_ =
                     (float)((int)fVar176 * 0x800000 + 0x3f800000) * auVar119._12_4_ + 1.0;
                auVar122 = rcpps(auVar119,auVar144);
                auVar106._0_4_ = auVar122._0_4_;
                fVar58 = auVar122._4_4_;
                fVar59 = auVar122._8_4_;
                fVar60 = auVar122._12_4_;
                auVar122._0_4_ =
                     (1.0 - auVar144._0_4_ * auVar106._0_4_) * auVar106._0_4_ + auVar106._0_4_;
                auVar122._4_4_ = (1.0 - auVar144._4_4_ * fVar58) * fVar58 + fVar58;
                auVar122._8_4_ = (1.0 - auVar144._8_4_ * fVar59) * fVar59 + fVar59;
                auVar122._12_4_ = (1.0 - auVar144._12_4_ * fVar60) * fVar60 + fVar60;
                break;
              case 4:
                auVar122 = minps(auVar122,_DAT_00595260);
                auVar122 = maxps(auVar122,_DAT_00595270);
                fVar171 = auVar122._0_4_ * 1.442695 + 0.5;
                fVar175 = auVar122._4_4_ * 1.442695 + 0.5;
                fVar176 = auVar122._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar122._12_4_ * 1.442695 + 0.5;
                fVar159 = (float)(int)fVar171;
                fVar168 = (float)(int)fVar175;
                fVar169 = (float)(int)fVar176;
                fVar170 = (float)(int)fVar177;
                fVar159 = fVar159 - (float)(-(uint)(fVar171 < fVar159) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar175 < fVar168) & 0x3f800000);
                fVar169 = fVar169 - (float)(-(uint)(fVar176 < fVar169) & 0x3f800000);
                fVar170 = fVar170 - (float)(-(uint)(fVar177 < fVar170) & 0x3f800000);
                fVar171 = auVar122._0_4_ - fVar159 * 0.6931472;
                fVar175 = auVar122._4_4_ - fVar168 * 0.6931472;
                fVar176 = auVar122._8_4_ - fVar169 * 0.6931472;
                fVar177 = auVar122._12_4_ - fVar170 * 0.6931472;
                auVar141._0_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) *
                     (fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) * fVar171 * fVar171)
                     + 1.0;
                auVar141._4_4_ =
                     (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                     (fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175)
                     + 1.0;
                auVar141._8_4_ =
                     (float)((int)fVar169 * 0x800000 + 0x3f800000) *
                     (fVar176 + 1.0 +
                     (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176
                       + 0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176)
                     + 1.0;
                auVar141._12_4_ =
                     (float)((int)fVar170 * 0x800000 + 0x3f800000) *
                     (fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177)
                     + 1.0;
                auVar122 = maxps(auVar141,_DAT_00595310);
                fVar171 = (float)(auVar122._0_4_ & 0x807fffff | 0x3f000000);
                fVar176 = (float)(auVar122._4_4_ & 0x807fffff | 0x3f000000);
                fVar159 = (float)(auVar122._8_4_ & 0x807fffff | 0x3f000000);
                fVar169 = (float)(auVar122._12_4_ & 0x807fffff | 0x3f000000);
                fVar175 = fVar171 + -1.0 + (float)(-(uint)(fVar171 < 0.70710677) & (uint)fVar171);
                fVar177 = fVar176 + -1.0 + (float)(-(uint)(fVar176 < 0.70710677) & (uint)fVar176);
                fVar168 = fVar159 + -1.0 + (float)(-(uint)(fVar159 < 0.70710677) & (uint)fVar159);
                fVar170 = fVar169 + -1.0 + (float)(-(uint)(fVar169 < 0.70710677) & (uint)fVar169);
                auVar142._0_4_ =
                     ~-(uint)(auVar141._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar122._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar171 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar175 +
                            (((((((((fVar175 * 0.070376836 + -0.1151461) * fVar175 + 0.116769984) *
                                   fVar175 + -0.12420141) * fVar175 + 0.14249323) * fVar175 +
                                -0.16668057) * fVar175 + 0.20000714) * fVar175 + -0.24999994) *
                              fVar175 + 0.3333333) * fVar175 + -0.5) * fVar175 * fVar175) * -2.0);
                auVar142._4_4_ =
                     ~-(uint)(auVar141._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar122._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar176 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar177 +
                            (((((((((fVar177 * 0.070376836 + -0.1151461) * fVar177 + 0.116769984) *
                                   fVar177 + -0.12420141) * fVar177 + 0.14249323) * fVar177 +
                                -0.16668057) * fVar177 + 0.20000714) * fVar177 + -0.24999994) *
                              fVar177 + 0.3333333) * fVar177 + -0.5) * fVar177 * fVar177) * -2.0);
                auVar142._8_4_ =
                     ~-(uint)(auVar141._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar122._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar159 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar168 +
                            (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                   fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                                -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                              fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
                auVar142._12_4_ =
                     ~-(uint)(auVar141._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar122._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar169 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar170 +
                            (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) *
                                   fVar170 + -0.12420141) * fVar170 + 0.14249323) * fVar170 +
                                -0.16668057) * fVar170 + 0.20000714) * fVar170 + -0.24999994) *
                              fVar170 + 0.3333333) * fVar170 + -0.5) * fVar170 * fVar170) * -2.0);
                auVar116._0_8_ =
                     CONCAT44(-(uint)(auVar141._4_4_ <= 0.0),-(uint)(auVar141._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar116._8_4_ = -(uint)(auVar141._8_4_ <= 0.0) & 0x7fffffff;
                auVar116._12_4_ = -(uint)(auVar141._12_4_ <= 0.0) & 0x7fffffff;
                auVar122 = minps(auVar116 | auVar142,_DAT_00595260);
                auVar122 = maxps(auVar122,_DAT_00595270);
                fVar171 = auVar122._0_4_ * 1.442695 + 0.5;
                fVar175 = auVar122._4_4_ * 1.442695 + 0.5;
                fVar176 = auVar122._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar122._12_4_ * 1.442695 + 0.5;
                fVar159 = (float)(int)fVar171;
                fVar168 = (float)(int)fVar175;
                fVar169 = (float)(int)fVar176;
                fVar170 = (float)(int)fVar177;
                fVar159 = fVar159 - (float)(-(uint)(fVar171 < fVar159) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar175 < fVar168) & 0x3f800000);
                fVar169 = fVar169 - (float)(-(uint)(fVar176 < fVar169) & 0x3f800000);
                fVar170 = fVar170 - (float)(-(uint)(fVar177 < fVar170) & 0x3f800000);
                fVar171 = auVar122._0_4_ - fVar159 * 0.6931472;
                fVar175 = auVar122._4_4_ - fVar168 * 0.6931472;
                fVar176 = auVar122._8_4_ - fVar169 * 0.6931472;
                fVar177 = auVar122._12_4_ - fVar170 * 0.6931472;
                auVar117._0_4_ =
                     fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) * fVar171 * fVar171;
                auVar117._4_4_ =
                     fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
                auVar117._8_4_ =
                     fVar176 + 1.0 +
                     (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176
                       + 0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176;
                auVar117._12_4_ =
                     fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
                auVar160._0_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) * auVar117._0_4_ + 1.0;
                auVar160._4_4_ =
                     (float)((int)fVar168 * 0x800000 + 0x3f800000) * auVar117._4_4_ + 1.0;
                auVar160._8_4_ =
                     (float)((int)fVar169 * 0x800000 + 0x3f800000) * auVar117._8_4_ + 1.0;
                auVar160._12_4_ =
                     (float)((int)fVar170 * 0x800000 + 0x3f800000) * auVar117._12_4_ + 1.0;
                auVar122 = rcpps(auVar117,auVar160);
                fVar171 = auVar122._0_4_;
                fVar175 = auVar122._4_4_;
                fVar176 = auVar122._8_4_;
                fVar177 = auVar122._12_4_;
                auVar122._0_4_ =
                     auVar106._0_4_ *
                     (fVar171 + fVar171 + -1.0 +
                     (2.0 - auVar160._0_4_ * (fVar171 + fVar171)) * fVar171);
                auVar122._4_4_ =
                     fVar58 * (fVar175 + fVar175 + -1.0 +
                              (2.0 - auVar160._4_4_ * (fVar175 + fVar175)) * fVar175);
                auVar122._8_4_ =
                     fVar59 * (fVar176 + fVar176 + -1.0 +
                              (2.0 - auVar160._8_4_ * (fVar176 + fVar176)) * fVar176);
                auVar122._12_4_ =
                     fVar60 * (fVar177 + fVar177 + -1.0 +
                              (2.0 - auVar160._12_4_ * (fVar177 + fVar177)) * fVar177);
                break;
              case 5:
                fVar171 = **(float **)(&this->field_0xe8 + (long)local_a0);
                fVar175 = (*(float **)(&this->field_0xe8 + (long)local_a0))[1];
                auVar121._0_4_ = fVar171 * auVar106._0_4_ + fVar175;
                auVar121._4_4_ = fVar171 * fVar58 + fVar175;
                auVar121._8_4_ = fVar171 * fVar59 + fVar175;
                auVar121._12_4_ = fVar171 * fVar60 + fVar175;
                auVar122 = maxps(auVar121,_DAT_00592030);
                auVar15._8_4_ = 0x3f800000;
                auVar15._0_8_ = 0x3f8000003f800000;
                auVar15._12_4_ = 0x3f800000;
                auVar123 = minps(auVar122,auVar15);
                auVar122._0_4_ = auVar106._0_4_ * auVar123._0_4_;
                auVar122._4_4_ = fVar58 * auVar123._4_4_;
                auVar122._8_4_ = fVar59 * auVar123._8_4_;
                auVar122._12_4_ = fVar60 * auVar123._12_4_;
              }
              auVar106._0_4_ = auVar104._0_4_;
              fVar58 = auVar104._4_4_;
              fVar59 = auVar104._8_4_;
              fVar60 = auVar104._12_4_;
              switch(iVar38) {
              case 0:
                auVar104 = maxps(auVar104,_DAT_00592030);
                break;
              case 1:
                auVar120 = maxps(auVar104,ZEXT816(0));
                auVar123 = minps(auVar104,ZEXT816(0));
                auVar106._0_4_ = **(float **)(&this->field_0xe8 + (long)local_a0);
                auVar104._4_4_ = auVar106._0_4_ * auVar123._4_4_ + auVar120._4_4_;
                auVar104._0_4_ = auVar106._0_4_ * auVar123._0_4_ + auVar120._0_4_;
                auVar104._8_4_ = auVar106._0_4_ * auVar123._8_4_ + auVar120._8_4_;
                auVar104._12_4_ = auVar106._0_4_ * auVar123._12_4_ + auVar120._12_4_;
                break;
              case 2:
                uVar6 = **(undefined4 **)(&this->field_0xe8 + (long)local_a0);
                uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)local_a0))[1];
                auVar126._4_4_ = uVar6;
                auVar126._0_4_ = uVar6;
                auVar126._8_4_ = uVar6;
                auVar126._12_4_ = uVar6;
                auVar147._4_4_ = uVar5;
                auVar147._0_4_ = uVar5;
                auVar147._8_4_ = uVar5;
                auVar147._12_4_ = uVar5;
                auVar106 = maxps(auVar104,auVar126);
                auVar104 = minps(auVar106,auVar147);
                break;
              case 3:
                auVar105._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
                auVar105._8_4_ = -fVar59;
                auVar105._12_4_ = -fVar60;
                auVar106 = minps(auVar105,_DAT_00595260);
                auVar123 = maxps(auVar106,_DAT_00595270);
                fVar58 = auVar123._0_4_ * 1.442695 + 0.5;
                fVar60 = auVar123._4_4_ * 1.442695 + 0.5;
                fVar175 = auVar123._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar123._12_4_ * 1.442695 + 0.5;
                auVar106._0_4_ = (float)(int)fVar58;
                fVar59 = (float)(int)fVar60;
                fVar171 = (float)(int)fVar175;
                fVar176 = (float)(int)fVar177;
                auVar106._0_4_ =
                     auVar106._0_4_ - (float)(-(uint)(fVar58 < auVar106._0_4_) & 0x3f800000);
                fVar59 = fVar59 - (float)(-(uint)(fVar60 < fVar59) & 0x3f800000);
                fVar171 = fVar171 - (float)(-(uint)(fVar175 < fVar171) & 0x3f800000);
                fVar176 = fVar176 - (float)(-(uint)(fVar177 < fVar176) & 0x3f800000);
                fVar58 = auVar106._0_4_ * -0.6931472 + auVar123._0_4_;
                fVar60 = fVar59 * -0.6931472 + auVar123._4_4_;
                fVar175 = fVar171 * -0.6931472 + auVar123._8_4_;
                fVar177 = fVar176 * -0.6931472 + auVar123._12_4_;
                auVar127._0_4_ =
                     fVar58 + 1.0 +
                     (((((fVar58 * 0.00019875691 + 0.0013981999) * fVar58 + 0.008333452) * fVar58 +
                       0.041665796) * fVar58 + 0.16666666) * fVar58 + 0.5) * fVar58 * fVar58;
                auVar127._4_4_ =
                     fVar60 + 1.0 +
                     (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                       0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60;
                auVar127._8_4_ =
                     fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
                auVar127._12_4_ =
                     fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
                auVar148._0_4_ =
                     (float)((int)auVar106._0_4_ * 0x800000 + 0x3f800000) * auVar127._0_4_ + 1.0;
                auVar148._4_4_ = (float)((int)fVar59 * 0x800000 + 0x3f800000) * auVar127._4_4_ + 1.0
                ;
                auVar148._8_4_ =
                     (float)((int)fVar171 * 0x800000 + 0x3f800000) * auVar127._8_4_ + 1.0;
                auVar148._12_4_ =
                     (float)((int)fVar176 * 0x800000 + 0x3f800000) * auVar127._12_4_ + 1.0;
                auVar106 = rcpps(auVar127,auVar148);
                fVar58 = auVar106._4_4_;
                fVar59 = auVar106._8_4_;
                fVar60 = auVar106._12_4_;
                auVar104._0_4_ =
                     (1.0 - auVar148._0_4_ * auVar106._0_4_) * auVar106._0_4_ + auVar106._0_4_;
                auVar104._4_4_ = (1.0 - auVar148._4_4_ * fVar58) * fVar58 + fVar58;
                auVar104._8_4_ = (1.0 - auVar148._8_4_ * fVar59) * fVar59 + fVar59;
                auVar104._12_4_ = (1.0 - auVar148._12_4_ * fVar60) * fVar60 + fVar60;
                break;
              case 4:
                auVar123 = minps(auVar104,_DAT_00595260);
                auVar123 = maxps(auVar123,_DAT_00595270);
                fVar171 = auVar123._0_4_ * 1.442695 + 0.5;
                fVar175 = auVar123._4_4_ * 1.442695 + 0.5;
                fVar176 = auVar123._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar123._12_4_ * 1.442695 + 0.5;
                fVar159 = (float)(int)fVar171;
                fVar168 = (float)(int)fVar175;
                fVar169 = (float)(int)fVar176;
                fVar170 = (float)(int)fVar177;
                fVar159 = fVar159 - (float)(-(uint)(fVar171 < fVar159) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar175 < fVar168) & 0x3f800000);
                fVar169 = fVar169 - (float)(-(uint)(fVar176 < fVar169) & 0x3f800000);
                fVar170 = fVar170 - (float)(-(uint)(fVar177 < fVar170) & 0x3f800000);
                fVar171 = auVar123._0_4_ - fVar159 * 0.6931472;
                fVar175 = auVar123._4_4_ - fVar168 * 0.6931472;
                fVar176 = auVar123._8_4_ - fVar169 * 0.6931472;
                fVar177 = auVar123._12_4_ - fVar170 * 0.6931472;
                auVar145._0_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) *
                     (fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) * fVar171 * fVar171)
                     + 1.0;
                auVar145._4_4_ =
                     (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                     (fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175)
                     + 1.0;
                auVar145._8_4_ =
                     (float)((int)fVar169 * 0x800000 + 0x3f800000) *
                     (fVar176 + 1.0 +
                     (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176
                       + 0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176)
                     + 1.0;
                auVar145._12_4_ =
                     (float)((int)fVar170 * 0x800000 + 0x3f800000) *
                     (fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177)
                     + 1.0;
                auVar123 = maxps(auVar145,_DAT_00595310);
                fVar171 = (float)(auVar123._0_4_ & 0x807fffff | 0x3f000000);
                fVar176 = (float)(auVar123._4_4_ & 0x807fffff | 0x3f000000);
                fVar159 = (float)(auVar123._8_4_ & 0x807fffff | 0x3f000000);
                fVar169 = (float)(auVar123._12_4_ & 0x807fffff | 0x3f000000);
                fVar175 = fVar171 + -1.0 + (float)(-(uint)(fVar171 < 0.70710677) & (uint)fVar171);
                fVar177 = fVar176 + -1.0 + (float)(-(uint)(fVar176 < 0.70710677) & (uint)fVar176);
                fVar168 = fVar159 + -1.0 + (float)(-(uint)(fVar159 < 0.70710677) & (uint)fVar159);
                fVar170 = fVar169 + -1.0 + (float)(-(uint)(fVar169 < 0.70710677) & (uint)fVar169);
                auVar146._0_4_ =
                     ~-(uint)(auVar145._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar123._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar171 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar175 +
                            (((((((((fVar175 * 0.070376836 + -0.1151461) * fVar175 + 0.116769984) *
                                   fVar175 + -0.12420141) * fVar175 + 0.14249323) * fVar175 +
                                -0.16668057) * fVar175 + 0.20000714) * fVar175 + -0.24999994) *
                              fVar175 + 0.3333333) * fVar175 + -0.5) * fVar175 * fVar175) * -2.0);
                auVar146._4_4_ =
                     ~-(uint)(auVar145._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar123._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar176 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar177 +
                            (((((((((fVar177 * 0.070376836 + -0.1151461) * fVar177 + 0.116769984) *
                                   fVar177 + -0.12420141) * fVar177 + 0.14249323) * fVar177 +
                                -0.16668057) * fVar177 + 0.20000714) * fVar177 + -0.24999994) *
                              fVar177 + 0.3333333) * fVar177 + -0.5) * fVar177 * fVar177) * -2.0);
                auVar146._8_4_ =
                     ~-(uint)(auVar145._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar123._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar159 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar168 +
                            (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                   fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                                -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                              fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
                auVar146._12_4_ =
                     ~-(uint)(auVar145._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar123._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar169 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar170 +
                            (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) *
                                   fVar170 + -0.12420141) * fVar170 + 0.14249323) * fVar170 +
                                -0.16668057) * fVar170 + 0.20000714) * fVar170 + -0.24999994) *
                              fVar170 + 0.3333333) * fVar170 + -0.5) * fVar170 * fVar170) * -2.0);
                auVar124._0_8_ =
                     CONCAT44(-(uint)(auVar145._4_4_ <= 0.0),-(uint)(auVar145._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar124._8_4_ = -(uint)(auVar145._8_4_ <= 0.0) & 0x7fffffff;
                auVar124._12_4_ = -(uint)(auVar145._12_4_ <= 0.0) & 0x7fffffff;
                auVar123 = minps(auVar124 | auVar146,_DAT_00595260);
                auVar123 = maxps(auVar123,_DAT_00595270);
                fVar171 = auVar123._0_4_ * 1.442695 + 0.5;
                fVar175 = auVar123._4_4_ * 1.442695 + 0.5;
                fVar176 = auVar123._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar123._12_4_ * 1.442695 + 0.5;
                fVar159 = (float)(int)fVar171;
                fVar168 = (float)(int)fVar175;
                fVar169 = (float)(int)fVar176;
                fVar170 = (float)(int)fVar177;
                fVar159 = fVar159 - (float)(-(uint)(fVar171 < fVar159) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar175 < fVar168) & 0x3f800000);
                fVar169 = fVar169 - (float)(-(uint)(fVar176 < fVar169) & 0x3f800000);
                fVar170 = fVar170 - (float)(-(uint)(fVar177 < fVar170) & 0x3f800000);
                fVar171 = auVar123._0_4_ - fVar159 * 0.6931472;
                fVar175 = auVar123._4_4_ - fVar168 * 0.6931472;
                fVar176 = auVar123._8_4_ - fVar169 * 0.6931472;
                fVar177 = auVar123._12_4_ - fVar170 * 0.6931472;
                auVar125._0_4_ =
                     fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) * fVar171 * fVar171;
                auVar125._4_4_ =
                     fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
                auVar125._8_4_ =
                     fVar176 + 1.0 +
                     (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176
                       + 0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176;
                auVar125._12_4_ =
                     fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
                auVar161._0_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) * auVar125._0_4_ + 1.0;
                auVar161._4_4_ =
                     (float)((int)fVar168 * 0x800000 + 0x3f800000) * auVar125._4_4_ + 1.0;
                auVar161._8_4_ =
                     (float)((int)fVar169 * 0x800000 + 0x3f800000) * auVar125._8_4_ + 1.0;
                auVar161._12_4_ =
                     (float)((int)fVar170 * 0x800000 + 0x3f800000) * auVar125._12_4_ + 1.0;
                auVar123 = rcpps(auVar125,auVar161);
                fVar171 = auVar123._0_4_;
                fVar175 = auVar123._4_4_;
                fVar176 = auVar123._8_4_;
                fVar177 = auVar123._12_4_;
                auVar104._0_4_ =
                     auVar106._0_4_ *
                     (fVar171 + fVar171 + -1.0 +
                     (2.0 - auVar161._0_4_ * (fVar171 + fVar171)) * fVar171);
                auVar104._4_4_ =
                     fVar58 * (fVar175 + fVar175 + -1.0 +
                              (2.0 - auVar161._4_4_ * (fVar175 + fVar175)) * fVar175);
                auVar104._8_4_ =
                     fVar59 * (fVar176 + fVar176 + -1.0 +
                              (2.0 - auVar161._8_4_ * (fVar176 + fVar176)) * fVar176);
                auVar104._12_4_ =
                     fVar60 * (fVar177 + fVar177 + -1.0 +
                              (2.0 - auVar161._12_4_ * (fVar177 + fVar177)) * fVar177);
                break;
              case 5:
                fVar171 = **(float **)(&this->field_0xe8 + (long)local_a0);
                fVar175 = (*(float **)(&this->field_0xe8 + (long)local_a0))[1];
                auVar128._0_4_ = fVar171 * auVar106._0_4_ + fVar175;
                auVar128._4_4_ = fVar171 * fVar58 + fVar175;
                auVar128._8_4_ = fVar171 * fVar59 + fVar175;
                auVar128._12_4_ = fVar171 * fVar60 + fVar175;
                auVar123 = maxps(auVar128,_DAT_00592030);
                auVar16._8_4_ = 0x3f800000;
                auVar16._0_8_ = 0x3f8000003f800000;
                auVar16._12_4_ = 0x3f800000;
                auVar123 = minps(auVar123,auVar16);
                auVar104._0_4_ = auVar106._0_4_ * auVar123._0_4_;
                auVar104._4_4_ = fVar58 * auVar123._4_4_;
                auVar104._8_4_ = fVar59 * auVar123._8_4_;
                auVar104._12_4_ = fVar60 * auVar123._12_4_;
              }
              auVar106._0_4_ = auVar61._0_4_;
              fVar58 = auVar61._4_4_;
              fVar59 = auVar61._8_4_;
              fVar60 = auVar61._12_4_;
              switch(iVar38) {
              case 0:
                auVar61 = maxps(auVar61,_DAT_00592030);
                break;
              case 1:
                auVar120 = maxps(auVar61,ZEXT816(0));
                auVar123 = minps(auVar61,ZEXT816(0));
                auVar106._0_4_ = **(float **)(&this->field_0xe8 + (long)local_a0);
                auVar61._4_4_ = auVar106._0_4_ * auVar123._4_4_ + auVar120._4_4_;
                auVar61._0_4_ = auVar106._0_4_ * auVar123._0_4_ + auVar120._0_4_;
                auVar61._8_4_ = auVar106._0_4_ * auVar123._8_4_ + auVar120._8_4_;
                auVar61._12_4_ = auVar106._0_4_ * auVar123._12_4_ + auVar120._12_4_;
                break;
              case 2:
                uVar6 = **(undefined4 **)(&this->field_0xe8 + (long)local_a0);
                uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)local_a0))[1];
                auVar131._4_4_ = uVar6;
                auVar131._0_4_ = uVar6;
                auVar131._8_4_ = uVar6;
                auVar131._12_4_ = uVar6;
                auVar151._4_4_ = uVar5;
                auVar151._0_4_ = uVar5;
                auVar151._8_4_ = uVar5;
                auVar151._12_4_ = uVar5;
                auVar106 = maxps(auVar61,auVar131);
                auVar61 = minps(auVar106,auVar151);
                break;
              case 3:
                auVar62._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
                auVar62._8_4_ = -fVar59;
                auVar62._12_4_ = -fVar60;
                auVar106 = minps(auVar62,_DAT_00595260);
                auVar123 = maxps(auVar106,_DAT_00595270);
                fVar58 = auVar123._0_4_ * 1.442695 + 0.5;
                fVar60 = auVar123._4_4_ * 1.442695 + 0.5;
                fVar175 = auVar123._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar123._12_4_ * 1.442695 + 0.5;
                auVar106._0_4_ = (float)(int)fVar58;
                fVar59 = (float)(int)fVar60;
                fVar171 = (float)(int)fVar175;
                fVar176 = (float)(int)fVar177;
                auVar106._0_4_ =
                     auVar106._0_4_ - (float)(-(uint)(fVar58 < auVar106._0_4_) & 0x3f800000);
                fVar59 = fVar59 - (float)(-(uint)(fVar60 < fVar59) & 0x3f800000);
                fVar171 = fVar171 - (float)(-(uint)(fVar175 < fVar171) & 0x3f800000);
                fVar176 = fVar176 - (float)(-(uint)(fVar177 < fVar176) & 0x3f800000);
                fVar58 = auVar106._0_4_ * -0.6931472 + auVar123._0_4_;
                fVar60 = fVar59 * -0.6931472 + auVar123._4_4_;
                fVar175 = fVar171 * -0.6931472 + auVar123._8_4_;
                fVar177 = fVar176 * -0.6931472 + auVar123._12_4_;
                auVar132._0_4_ =
                     fVar58 + 1.0 +
                     (((((fVar58 * 0.00019875691 + 0.0013981999) * fVar58 + 0.008333452) * fVar58 +
                       0.041665796) * fVar58 + 0.16666666) * fVar58 + 0.5) * fVar58 * fVar58;
                auVar132._4_4_ =
                     fVar60 + 1.0 +
                     (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                       0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60;
                auVar132._8_4_ =
                     fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
                auVar132._12_4_ =
                     fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
                auVar152._0_4_ =
                     (float)((int)auVar106._0_4_ * 0x800000 + 0x3f800000) * auVar132._0_4_ + 1.0;
                auVar152._4_4_ = (float)((int)fVar59 * 0x800000 + 0x3f800000) * auVar132._4_4_ + 1.0
                ;
                auVar152._8_4_ =
                     (float)((int)fVar171 * 0x800000 + 0x3f800000) * auVar132._8_4_ + 1.0;
                auVar152._12_4_ =
                     (float)((int)fVar176 * 0x800000 + 0x3f800000) * auVar132._12_4_ + 1.0;
                auVar106 = rcpps(auVar132,auVar152);
                fVar58 = auVar106._4_4_;
                fVar59 = auVar106._8_4_;
                fVar60 = auVar106._12_4_;
                auVar61._0_4_ =
                     (1.0 - auVar152._0_4_ * auVar106._0_4_) * auVar106._0_4_ + auVar106._0_4_;
                auVar61._4_4_ = (1.0 - auVar152._4_4_ * fVar58) * fVar58 + fVar58;
                auVar61._8_4_ = (1.0 - auVar152._8_4_ * fVar59) * fVar59 + fVar59;
                auVar61._12_4_ = (1.0 - auVar152._12_4_ * fVar60) * fVar60 + fVar60;
                break;
              case 4:
                auVar123 = minps(auVar61,_DAT_00595260);
                auVar123 = maxps(auVar123,_DAT_00595270);
                fVar171 = auVar123._0_4_ * 1.442695 + 0.5;
                fVar175 = auVar123._4_4_ * 1.442695 + 0.5;
                fVar176 = auVar123._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar123._12_4_ * 1.442695 + 0.5;
                fVar159 = (float)(int)fVar171;
                fVar168 = (float)(int)fVar175;
                fVar169 = (float)(int)fVar176;
                fVar170 = (float)(int)fVar177;
                fVar159 = fVar159 - (float)(-(uint)(fVar171 < fVar159) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar175 < fVar168) & 0x3f800000);
                fVar169 = fVar169 - (float)(-(uint)(fVar176 < fVar169) & 0x3f800000);
                fVar170 = fVar170 - (float)(-(uint)(fVar177 < fVar170) & 0x3f800000);
                fVar171 = auVar123._0_4_ - fVar159 * 0.6931472;
                fVar175 = auVar123._4_4_ - fVar168 * 0.6931472;
                fVar176 = auVar123._8_4_ - fVar169 * 0.6931472;
                fVar177 = auVar123._12_4_ - fVar170 * 0.6931472;
                auVar149._0_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) *
                     (fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) * fVar171 * fVar171)
                     + 1.0;
                auVar149._4_4_ =
                     (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                     (fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175)
                     + 1.0;
                auVar149._8_4_ =
                     (float)((int)fVar169 * 0x800000 + 0x3f800000) *
                     (fVar176 + 1.0 +
                     (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176
                       + 0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176)
                     + 1.0;
                auVar149._12_4_ =
                     (float)((int)fVar170 * 0x800000 + 0x3f800000) *
                     (fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177)
                     + 1.0;
                auVar123 = maxps(auVar149,_DAT_00595310);
                fVar171 = (float)(auVar123._0_4_ & 0x807fffff | 0x3f000000);
                fVar176 = (float)(auVar123._4_4_ & 0x807fffff | 0x3f000000);
                fVar159 = (float)(auVar123._8_4_ & 0x807fffff | 0x3f000000);
                fVar169 = (float)(auVar123._12_4_ & 0x807fffff | 0x3f000000);
                fVar175 = fVar171 + -1.0 + (float)(-(uint)(fVar171 < 0.70710677) & (uint)fVar171);
                fVar177 = fVar176 + -1.0 + (float)(-(uint)(fVar176 < 0.70710677) & (uint)fVar176);
                fVar168 = fVar159 + -1.0 + (float)(-(uint)(fVar159 < 0.70710677) & (uint)fVar159);
                fVar170 = fVar169 + -1.0 + (float)(-(uint)(fVar169 < 0.70710677) & (uint)fVar169);
                auVar150._0_4_ =
                     ~-(uint)(auVar149._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar123._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar171 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar175 +
                            (((((((((fVar175 * 0.070376836 + -0.1151461) * fVar175 + 0.116769984) *
                                   fVar175 + -0.12420141) * fVar175 + 0.14249323) * fVar175 +
                                -0.16668057) * fVar175 + 0.20000714) * fVar175 + -0.24999994) *
                              fVar175 + 0.3333333) * fVar175 + -0.5) * fVar175 * fVar175) * -2.0);
                auVar150._4_4_ =
                     ~-(uint)(auVar149._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar123._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar176 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar177 +
                            (((((((((fVar177 * 0.070376836 + -0.1151461) * fVar177 + 0.116769984) *
                                   fVar177 + -0.12420141) * fVar177 + 0.14249323) * fVar177 +
                                -0.16668057) * fVar177 + 0.20000714) * fVar177 + -0.24999994) *
                              fVar177 + 0.3333333) * fVar177 + -0.5) * fVar177 * fVar177) * -2.0);
                auVar150._8_4_ =
                     ~-(uint)(auVar149._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar123._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar159 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar168 +
                            (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                   fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                                -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                              fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
                auVar150._12_4_ =
                     ~-(uint)(auVar149._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar123._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar169 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar170 +
                            (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) *
                                   fVar170 + -0.12420141) * fVar170 + 0.14249323) * fVar170 +
                                -0.16668057) * fVar170 + 0.20000714) * fVar170 + -0.24999994) *
                              fVar170 + 0.3333333) * fVar170 + -0.5) * fVar170 * fVar170) * -2.0);
                auVar129._0_8_ =
                     CONCAT44(-(uint)(auVar149._4_4_ <= 0.0),-(uint)(auVar149._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar129._8_4_ = -(uint)(auVar149._8_4_ <= 0.0) & 0x7fffffff;
                auVar129._12_4_ = -(uint)(auVar149._12_4_ <= 0.0) & 0x7fffffff;
                auVar123 = minps(auVar129 | auVar150,_DAT_00595260);
                auVar123 = maxps(auVar123,_DAT_00595270);
                fVar171 = auVar123._0_4_ * 1.442695 + 0.5;
                fVar175 = auVar123._4_4_ * 1.442695 + 0.5;
                fVar176 = auVar123._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar123._12_4_ * 1.442695 + 0.5;
                fVar159 = (float)(int)fVar171;
                fVar168 = (float)(int)fVar175;
                fVar169 = (float)(int)fVar176;
                fVar170 = (float)(int)fVar177;
                fVar159 = fVar159 - (float)(-(uint)(fVar171 < fVar159) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar175 < fVar168) & 0x3f800000);
                fVar169 = fVar169 - (float)(-(uint)(fVar176 < fVar169) & 0x3f800000);
                fVar170 = fVar170 - (float)(-(uint)(fVar177 < fVar170) & 0x3f800000);
                fVar171 = auVar123._0_4_ - fVar159 * 0.6931472;
                fVar175 = auVar123._4_4_ - fVar168 * 0.6931472;
                fVar176 = auVar123._8_4_ - fVar169 * 0.6931472;
                fVar177 = auVar123._12_4_ - fVar170 * 0.6931472;
                auVar130._0_4_ =
                     fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) * fVar171 * fVar171;
                auVar130._4_4_ =
                     fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
                auVar130._8_4_ =
                     fVar176 + 1.0 +
                     (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176
                       + 0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176;
                auVar130._12_4_ =
                     fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
                auVar162._0_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) * auVar130._0_4_ + 1.0;
                auVar162._4_4_ =
                     (float)((int)fVar168 * 0x800000 + 0x3f800000) * auVar130._4_4_ + 1.0;
                auVar162._8_4_ =
                     (float)((int)fVar169 * 0x800000 + 0x3f800000) * auVar130._8_4_ + 1.0;
                auVar162._12_4_ =
                     (float)((int)fVar170 * 0x800000 + 0x3f800000) * auVar130._12_4_ + 1.0;
                auVar123 = rcpps(auVar130,auVar162);
                fVar171 = auVar123._0_4_;
                fVar175 = auVar123._4_4_;
                fVar176 = auVar123._8_4_;
                fVar177 = auVar123._12_4_;
                auVar61._0_4_ =
                     auVar106._0_4_ *
                     (fVar171 + fVar171 + -1.0 +
                     (2.0 - auVar162._0_4_ * (fVar171 + fVar171)) * fVar171);
                auVar61._4_4_ =
                     fVar58 * (fVar175 + fVar175 + -1.0 +
                              (2.0 - auVar162._4_4_ * (fVar175 + fVar175)) * fVar175);
                auVar61._8_4_ =
                     fVar59 * (fVar176 + fVar176 + -1.0 +
                              (2.0 - auVar162._8_4_ * (fVar176 + fVar176)) * fVar176);
                auVar61._12_4_ =
                     fVar60 * (fVar177 + fVar177 + -1.0 +
                              (2.0 - auVar162._12_4_ * (fVar177 + fVar177)) * fVar177);
                break;
              case 5:
                fVar171 = **(float **)(&this->field_0xe8 + (long)local_a0);
                fVar175 = (*(float **)(&this->field_0xe8 + (long)local_a0))[1];
                auVar133._0_4_ = fVar171 * auVar106._0_4_ + fVar175;
                auVar133._4_4_ = fVar171 * fVar58 + fVar175;
                auVar133._8_4_ = fVar171 * fVar59 + fVar175;
                auVar133._12_4_ = fVar171 * fVar60 + fVar175;
                auVar123 = maxps(auVar133,_DAT_00592030);
                auVar17._8_4_ = 0x3f800000;
                auVar17._0_8_ = 0x3f8000003f800000;
                auVar17._12_4_ = 0x3f800000;
                auVar123 = minps(auVar123,auVar17);
                auVar61._0_4_ = auVar106._0_4_ * auVar123._0_4_;
                auVar61._4_4_ = fVar58 * auVar123._4_4_;
                auVar61._8_4_ = fVar59 * auVar123._8_4_;
                auVar61._12_4_ = fVar60 * auVar123._12_4_;
              }
              auVar106._0_4_ = auVar79._0_4_;
              fVar58 = auVar79._4_4_;
              fVar59 = auVar79._8_4_;
              fVar60 = auVar79._12_4_;
              switch(iVar38) {
              case 0:
                auVar79 = maxps(auVar79,_DAT_00592030);
                break;
              case 1:
                auVar120 = maxps(auVar79,ZEXT816(0));
                auVar123 = minps(auVar79,ZEXT816(0));
                auVar106._0_4_ = **(float **)(&this->field_0xe8 + (long)local_a0);
                auVar79._4_4_ = auVar106._0_4_ * auVar123._4_4_ + auVar120._4_4_;
                auVar79._0_4_ = auVar106._0_4_ * auVar123._0_4_ + auVar120._0_4_;
                auVar79._8_4_ = auVar106._0_4_ * auVar123._8_4_ + auVar120._8_4_;
                auVar79._12_4_ = auVar106._0_4_ * auVar123._12_4_ + auVar120._12_4_;
                break;
              case 2:
                uVar6 = **(undefined4 **)(&this->field_0xe8 + (long)local_a0);
                uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)local_a0))[1];
                auVar136._4_4_ = uVar6;
                auVar136._0_4_ = uVar6;
                auVar136._8_4_ = uVar6;
                auVar136._12_4_ = uVar6;
                auVar155._4_4_ = uVar5;
                auVar155._0_4_ = uVar5;
                auVar155._8_4_ = uVar5;
                auVar155._12_4_ = uVar5;
                auVar106 = maxps(auVar79,auVar136);
                auVar79 = minps(auVar106,auVar155);
                break;
              case 3:
                auVar80._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
                auVar80._8_4_ = -fVar59;
                auVar80._12_4_ = -fVar60;
                auVar106 = minps(auVar80,_DAT_00595260);
                auVar123 = maxps(auVar106,_DAT_00595270);
                fVar58 = auVar123._0_4_ * 1.442695 + 0.5;
                fVar60 = auVar123._4_4_ * 1.442695 + 0.5;
                fVar175 = auVar123._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar123._12_4_ * 1.442695 + 0.5;
                auVar106._0_4_ = (float)(int)fVar58;
                fVar59 = (float)(int)fVar60;
                fVar171 = (float)(int)fVar175;
                fVar176 = (float)(int)fVar177;
                auVar106._0_4_ =
                     auVar106._0_4_ - (float)(-(uint)(fVar58 < auVar106._0_4_) & 0x3f800000);
                fVar59 = fVar59 - (float)(-(uint)(fVar60 < fVar59) & 0x3f800000);
                fVar171 = fVar171 - (float)(-(uint)(fVar175 < fVar171) & 0x3f800000);
                fVar176 = fVar176 - (float)(-(uint)(fVar177 < fVar176) & 0x3f800000);
                fVar58 = auVar106._0_4_ * -0.6931472 + auVar123._0_4_;
                fVar60 = fVar59 * -0.6931472 + auVar123._4_4_;
                fVar175 = fVar171 * -0.6931472 + auVar123._8_4_;
                fVar177 = fVar176 * -0.6931472 + auVar123._12_4_;
                auVar137._0_4_ =
                     fVar58 + 1.0 +
                     (((((fVar58 * 0.00019875691 + 0.0013981999) * fVar58 + 0.008333452) * fVar58 +
                       0.041665796) * fVar58 + 0.16666666) * fVar58 + 0.5) * fVar58 * fVar58;
                auVar137._4_4_ =
                     fVar60 + 1.0 +
                     (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                       0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60;
                auVar137._8_4_ =
                     fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
                auVar137._12_4_ =
                     fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
                auVar156._0_4_ =
                     (float)((int)auVar106._0_4_ * 0x800000 + 0x3f800000) * auVar137._0_4_ + 1.0;
                auVar156._4_4_ = (float)((int)fVar59 * 0x800000 + 0x3f800000) * auVar137._4_4_ + 1.0
                ;
                auVar156._8_4_ =
                     (float)((int)fVar171 * 0x800000 + 0x3f800000) * auVar137._8_4_ + 1.0;
                auVar156._12_4_ =
                     (float)((int)fVar176 * 0x800000 + 0x3f800000) * auVar137._12_4_ + 1.0;
                auVar106 = rcpps(auVar137,auVar156);
                fVar58 = auVar106._4_4_;
                fVar59 = auVar106._8_4_;
                fVar60 = auVar106._12_4_;
                auVar79._0_4_ =
                     (1.0 - auVar156._0_4_ * auVar106._0_4_) * auVar106._0_4_ + auVar106._0_4_;
                auVar79._4_4_ = (1.0 - auVar156._4_4_ * fVar58) * fVar58 + fVar58;
                auVar79._8_4_ = (1.0 - auVar156._8_4_ * fVar59) * fVar59 + fVar59;
                auVar79._12_4_ = (1.0 - auVar156._12_4_ * fVar60) * fVar60 + fVar60;
                break;
              case 4:
                auVar123 = minps(auVar79,_DAT_00595260);
                auVar123 = maxps(auVar123,_DAT_00595270);
                fVar171 = auVar123._0_4_ * 1.442695 + 0.5;
                fVar175 = auVar123._4_4_ * 1.442695 + 0.5;
                fVar176 = auVar123._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar123._12_4_ * 1.442695 + 0.5;
                fVar159 = (float)(int)fVar171;
                fVar168 = (float)(int)fVar175;
                fVar169 = (float)(int)fVar176;
                fVar170 = (float)(int)fVar177;
                fVar159 = fVar159 - (float)(-(uint)(fVar171 < fVar159) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar175 < fVar168) & 0x3f800000);
                fVar169 = fVar169 - (float)(-(uint)(fVar176 < fVar169) & 0x3f800000);
                fVar170 = fVar170 - (float)(-(uint)(fVar177 < fVar170) & 0x3f800000);
                fVar171 = auVar123._0_4_ - fVar159 * 0.6931472;
                fVar175 = auVar123._4_4_ - fVar168 * 0.6931472;
                fVar176 = auVar123._8_4_ - fVar169 * 0.6931472;
                fVar177 = auVar123._12_4_ - fVar170 * 0.6931472;
                auVar153._0_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) *
                     (fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) * fVar171 * fVar171)
                     + 1.0;
                auVar153._4_4_ =
                     (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                     (fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175)
                     + 1.0;
                auVar153._8_4_ =
                     (float)((int)fVar169 * 0x800000 + 0x3f800000) *
                     (fVar176 + 1.0 +
                     (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176
                       + 0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176)
                     + 1.0;
                auVar153._12_4_ =
                     (float)((int)fVar170 * 0x800000 + 0x3f800000) *
                     (fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177)
                     + 1.0;
                auVar123 = maxps(auVar153,_DAT_00595310);
                fVar171 = (float)(auVar123._0_4_ & 0x807fffff | 0x3f000000);
                fVar176 = (float)(auVar123._4_4_ & 0x807fffff | 0x3f000000);
                fVar159 = (float)(auVar123._8_4_ & 0x807fffff | 0x3f000000);
                fVar169 = (float)(auVar123._12_4_ & 0x807fffff | 0x3f000000);
                fVar175 = fVar171 + -1.0 + (float)(-(uint)(fVar171 < 0.70710677) & (uint)fVar171);
                fVar177 = fVar176 + -1.0 + (float)(-(uint)(fVar176 < 0.70710677) & (uint)fVar176);
                fVar168 = fVar159 + -1.0 + (float)(-(uint)(fVar159 < 0.70710677) & (uint)fVar159);
                fVar170 = fVar169 + -1.0 + (float)(-(uint)(fVar169 < 0.70710677) & (uint)fVar169);
                auVar154._0_4_ =
                     ~-(uint)(auVar153._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar123._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar171 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar175 +
                            (((((((((fVar175 * 0.070376836 + -0.1151461) * fVar175 + 0.116769984) *
                                   fVar175 + -0.12420141) * fVar175 + 0.14249323) * fVar175 +
                                -0.16668057) * fVar175 + 0.20000714) * fVar175 + -0.24999994) *
                              fVar175 + 0.3333333) * fVar175 + -0.5) * fVar175 * fVar175) * -2.0);
                auVar154._4_4_ =
                     ~-(uint)(auVar153._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar123._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar176 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar177 +
                            (((((((((fVar177 * 0.070376836 + -0.1151461) * fVar177 + 0.116769984) *
                                   fVar177 + -0.12420141) * fVar177 + 0.14249323) * fVar177 +
                                -0.16668057) * fVar177 + 0.20000714) * fVar177 + -0.24999994) *
                              fVar177 + 0.3333333) * fVar177 + -0.5) * fVar177 * fVar177) * -2.0);
                auVar154._8_4_ =
                     ~-(uint)(auVar153._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar123._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar159 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar168 +
                            (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                   fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                                -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                              fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
                auVar154._12_4_ =
                     ~-(uint)(auVar153._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar123._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar169 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar170 +
                            (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) *
                                   fVar170 + -0.12420141) * fVar170 + 0.14249323) * fVar170 +
                                -0.16668057) * fVar170 + 0.20000714) * fVar170 + -0.24999994) *
                              fVar170 + 0.3333333) * fVar170 + -0.5) * fVar170 * fVar170) * -2.0);
                auVar134._0_8_ =
                     CONCAT44(-(uint)(auVar153._4_4_ <= 0.0),-(uint)(auVar153._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar134._8_4_ = -(uint)(auVar153._8_4_ <= 0.0) & 0x7fffffff;
                auVar134._12_4_ = -(uint)(auVar153._12_4_ <= 0.0) & 0x7fffffff;
                auVar123 = minps(auVar134 | auVar154,_DAT_00595260);
                auVar123 = maxps(auVar123,_DAT_00595270);
                fVar171 = auVar123._0_4_ * 1.442695 + 0.5;
                fVar175 = auVar123._4_4_ * 1.442695 + 0.5;
                fVar176 = auVar123._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar123._12_4_ * 1.442695 + 0.5;
                fVar159 = (float)(int)fVar171;
                fVar168 = (float)(int)fVar175;
                fVar169 = (float)(int)fVar176;
                fVar170 = (float)(int)fVar177;
                fVar159 = fVar159 - (float)(-(uint)(fVar171 < fVar159) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar175 < fVar168) & 0x3f800000);
                fVar169 = fVar169 - (float)(-(uint)(fVar176 < fVar169) & 0x3f800000);
                fVar170 = fVar170 - (float)(-(uint)(fVar177 < fVar170) & 0x3f800000);
                fVar171 = auVar123._0_4_ - fVar159 * 0.6931472;
                fVar175 = auVar123._4_4_ - fVar168 * 0.6931472;
                fVar176 = auVar123._8_4_ - fVar169 * 0.6931472;
                fVar177 = auVar123._12_4_ - fVar170 * 0.6931472;
                auVar135._0_4_ =
                     fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) * fVar171 * fVar171;
                auVar135._4_4_ =
                     fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
                auVar135._8_4_ =
                     fVar176 + 1.0 +
                     (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176
                       + 0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176;
                auVar135._12_4_ =
                     fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
                auVar163._0_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) * auVar135._0_4_ + 1.0;
                auVar163._4_4_ =
                     (float)((int)fVar168 * 0x800000 + 0x3f800000) * auVar135._4_4_ + 1.0;
                auVar163._8_4_ =
                     (float)((int)fVar169 * 0x800000 + 0x3f800000) * auVar135._8_4_ + 1.0;
                auVar163._12_4_ =
                     (float)((int)fVar170 * 0x800000 + 0x3f800000) * auVar135._12_4_ + 1.0;
                auVar123 = rcpps(auVar135,auVar163);
                fVar171 = auVar123._0_4_;
                fVar175 = auVar123._4_4_;
                fVar176 = auVar123._8_4_;
                fVar177 = auVar123._12_4_;
                auVar79._0_4_ =
                     auVar106._0_4_ *
                     (fVar171 + fVar171 + -1.0 +
                     (2.0 - auVar163._0_4_ * (fVar171 + fVar171)) * fVar171);
                auVar79._4_4_ =
                     fVar58 * (fVar175 + fVar175 + -1.0 +
                              (2.0 - auVar163._4_4_ * (fVar175 + fVar175)) * fVar175);
                auVar79._8_4_ =
                     fVar59 * (fVar176 + fVar176 + -1.0 +
                              (2.0 - auVar163._8_4_ * (fVar176 + fVar176)) * fVar176);
                auVar79._12_4_ =
                     fVar60 * (fVar177 + fVar177 + -1.0 +
                              (2.0 - auVar163._12_4_ * (fVar177 + fVar177)) * fVar177);
                break;
              case 5:
                fVar171 = **(float **)(&this->field_0xe8 + (long)local_a0);
                fVar175 = (*(float **)(&this->field_0xe8 + (long)local_a0))[1];
                auVar138._0_4_ = fVar171 * auVar106._0_4_ + fVar175;
                auVar138._4_4_ = fVar171 * fVar58 + fVar175;
                auVar138._8_4_ = fVar171 * fVar59 + fVar175;
                auVar138._12_4_ = fVar171 * fVar60 + fVar175;
                auVar123 = maxps(auVar138,_DAT_00592030);
                auVar18._8_4_ = 0x3f800000;
                auVar18._0_8_ = 0x3f8000003f800000;
                auVar18._12_4_ = 0x3f800000;
                auVar123 = minps(auVar123,auVar18);
                auVar79._0_4_ = auVar106._0_4_ * auVar123._0_4_;
                auVar79._4_4_ = fVar58 * auVar123._4_4_;
                auVar79._8_4_ = fVar59 * auVar123._8_4_;
                auVar79._12_4_ = fVar60 * auVar123._12_4_;
              }
              auVar139._0_8_ = auVar122._0_8_;
              auVar139._8_4_ = auVar122._4_4_;
              auVar139._12_4_ = auVar104._4_4_;
              auVar81._4_4_ = auVar104._0_4_;
              auVar81._0_4_ = auVar122._0_4_;
              auVar157._0_8_ = auVar61._0_8_;
              auVar157._8_4_ = auVar61._4_4_;
              auVar157._12_4_ = auVar79._4_4_;
              auVar158._8_8_ = auVar157._8_8_;
              auVar81._12_4_ = auVar79._0_4_;
              auVar81._8_4_ = auVar61._0_4_;
              auVar53._0_8_ = CONCAT44(auVar104._8_4_,auVar122._8_4_);
              auVar53._8_4_ = auVar122._12_4_;
              auVar53._12_4_ = auVar104._12_4_;
              auVar63._0_8_ = CONCAT44(auVar79._8_4_,auVar61._8_4_);
              auVar63._8_4_ = auVar61._12_4_;
              auVar63._12_4_ = auVar79._12_4_;
              auVar158._0_8_ = auVar139._8_8_;
              auVar107._8_8_ = auVar63._0_8_;
              auVar107._0_8_ = auVar53._0_8_;
              auVar64._8_8_ = auVar63._8_8_;
              auVar64._0_8_ = auVar53._8_8_;
              *pauVar31 = auVar81;
              pauVar31[1] = auVar158;
              pauVar31[2] = auVar107;
              pauVar31[3] = auVar64;
              pauVar31 = pauVar31 + 4;
              uVar35 = uVar35 + 1;
            } while (uVar35 != local_88);
          }
          if ((iVar9 == 1 & bVar33 & 0 < (int)uVar43) != 0) {
            pauVar31 = (undefined1 (*) [16])
                       (top_blob->w * local_140 * top_blob->elemsize + (long)top_blob->data);
            uVar35 = 0;
            do {
              if (lVar10 == 0) {
                auVar54 = ZEXT816(0);
              }
              else {
                auVar54 = *(undefined1 (*) [16])(lVar10 + uVar35 * 0x10);
              }
              if (0 < (int)uVar34) {
                pfVar40 = (float *)((long)(this->weight_data_tm).w * uVar35 *
                                    (this->weight_data_tm).elemsize +
                                   (long)(this->weight_data_tm).data);
                lVar39 = 0;
                auVar122 = auVar54;
                do {
                  auVar106._0_4_ =
                       *(float *)((long)bottom_blob->data +
                                 lVar39 * 4 +
                                 bottom_blob->elemsize * local_140 * (long)bottom_blob->w);
                  auVar54._0_4_ = auVar122._0_4_ + *pfVar40 * auVar106._0_4_;
                  auVar54._4_4_ = auVar122._4_4_ + pfVar40[1] * auVar106._0_4_;
                  auVar54._8_4_ = auVar122._8_4_ + pfVar40[2] * auVar106._0_4_;
                  auVar54._12_4_ = auVar122._12_4_ + pfVar40[3] * auVar106._0_4_;
                  pfVar40 = pfVar40 + 4;
                  lVar39 = lVar39 + 1;
                  auVar122 = auVar54;
                } while (uVar34 != (uint)lVar39);
              }
              auVar106._0_4_ = auVar54._0_4_;
              fVar58 = auVar54._4_4_;
              fVar59 = auVar54._8_4_;
              fVar60 = auVar54._12_4_;
              switch(iVar30) {
              case 1:
                auVar54 = maxps(auVar54,_DAT_00592030);
                break;
              case 2:
                auVar123 = maxps(auVar54,ZEXT816(0));
                auVar122 = minps(auVar54,ZEXT816(0));
                auVar106._0_4_ = **(float **)(&this->field_0xe8 + (long)local_a0);
                auVar54._4_4_ = auVar106._0_4_ * auVar122._4_4_ + auVar123._4_4_;
                auVar54._0_4_ = auVar106._0_4_ * auVar122._0_4_ + auVar123._0_4_;
                auVar54._8_4_ = auVar106._0_4_ * auVar122._8_4_ + auVar123._8_4_;
                auVar54._12_4_ = auVar106._0_4_ * auVar122._12_4_ + auVar123._12_4_;
                break;
              case 3:
                uVar6 = **(undefined4 **)(&this->field_0xe8 + (long)local_a0);
                uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)local_a0))[1];
                auVar67._4_4_ = uVar6;
                auVar67._0_4_ = uVar6;
                auVar67._8_4_ = uVar6;
                auVar67._12_4_ = uVar6;
                auVar84._4_4_ = uVar5;
                auVar84._0_4_ = uVar5;
                auVar84._8_4_ = uVar5;
                auVar84._12_4_ = uVar5;
                auVar122 = maxps(auVar54,auVar67);
                auVar54 = minps(auVar122,auVar84);
                break;
              case 4:
                auVar55._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
                auVar55._8_4_ = -fVar59;
                auVar55._12_4_ = -fVar60;
                auVar122 = minps(auVar55,_DAT_00595260);
                auVar122 = maxps(auVar122,_DAT_00595270);
                fVar58 = auVar122._0_4_ * 1.442695 + 0.5;
                fVar60 = auVar122._4_4_ * 1.442695 + 0.5;
                fVar175 = auVar122._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar122._12_4_ * 1.442695 + 0.5;
                auVar106._0_4_ = (float)(int)fVar58;
                fVar59 = (float)(int)fVar60;
                fVar171 = (float)(int)fVar175;
                fVar176 = (float)(int)fVar177;
                auVar106._0_4_ =
                     auVar106._0_4_ - (float)(-(uint)(fVar58 < auVar106._0_4_) & 0x3f800000);
                fVar59 = fVar59 - (float)(-(uint)(fVar60 < fVar59) & 0x3f800000);
                fVar171 = fVar171 - (float)(-(uint)(fVar175 < fVar171) & 0x3f800000);
                fVar176 = fVar176 - (float)(-(uint)(fVar177 < fVar176) & 0x3f800000);
                fVar58 = auVar106._0_4_ * -0.6931472 + auVar122._0_4_;
                fVar60 = fVar59 * -0.6931472 + auVar122._4_4_;
                fVar175 = fVar171 * -0.6931472 + auVar122._8_4_;
                fVar177 = fVar176 * -0.6931472 + auVar122._12_4_;
                auVar68._0_4_ =
                     fVar58 + 1.0 +
                     (((((fVar58 * 0.00019875691 + 0.0013981999) * fVar58 + 0.008333452) * fVar58 +
                       0.041665796) * fVar58 + 0.16666666) * fVar58 + 0.5) * fVar58 * fVar58;
                auVar68._4_4_ =
                     fVar60 + 1.0 +
                     (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                       0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60;
                auVar68._8_4_ =
                     fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
                auVar68._12_4_ =
                     fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
                auVar85._0_4_ =
                     (float)((int)auVar106._0_4_ * 0x800000 + 0x3f800000) * auVar68._0_4_ + 1.0;
                auVar85._4_4_ = (float)((int)fVar59 * 0x800000 + 0x3f800000) * auVar68._4_4_ + 1.0;
                auVar85._8_4_ = (float)((int)fVar171 * 0x800000 + 0x3f800000) * auVar68._8_4_ + 1.0;
                auVar85._12_4_ =
                     (float)((int)fVar176 * 0x800000 + 0x3f800000) * auVar68._12_4_ + 1.0;
                auVar122 = rcpps(auVar68,auVar85);
                auVar106._0_4_ = auVar122._0_4_;
                fVar58 = auVar122._4_4_;
                fVar59 = auVar122._8_4_;
                fVar60 = auVar122._12_4_;
                auVar54._0_4_ =
                     (1.0 - auVar85._0_4_ * auVar106._0_4_) * auVar106._0_4_ + auVar106._0_4_;
                auVar54._4_4_ = (1.0 - auVar85._4_4_ * fVar58) * fVar58 + fVar58;
                auVar54._8_4_ = (1.0 - auVar85._8_4_ * fVar59) * fVar59 + fVar59;
                auVar54._12_4_ = (1.0 - auVar85._12_4_ * fVar60) * fVar60 + fVar60;
                break;
              case 5:
                auVar122 = minps(auVar54,_DAT_00595260);
                auVar122 = maxps(auVar122,_DAT_00595270);
                fVar171 = auVar122._0_4_ * 1.442695 + 0.5;
                fVar175 = auVar122._4_4_ * 1.442695 + 0.5;
                fVar176 = auVar122._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar122._12_4_ * 1.442695 + 0.5;
                fVar159 = (float)(int)fVar171;
                fVar168 = (float)(int)fVar175;
                fVar169 = (float)(int)fVar176;
                fVar170 = (float)(int)fVar177;
                fVar159 = fVar159 - (float)(-(uint)(fVar171 < fVar159) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar175 < fVar168) & 0x3f800000);
                fVar169 = fVar169 - (float)(-(uint)(fVar176 < fVar169) & 0x3f800000);
                fVar170 = fVar170 - (float)(-(uint)(fVar177 < fVar170) & 0x3f800000);
                fVar171 = auVar122._0_4_ - fVar159 * 0.6931472;
                fVar175 = auVar122._4_4_ - fVar168 * 0.6931472;
                fVar176 = auVar122._8_4_ - fVar169 * 0.6931472;
                fVar177 = auVar122._12_4_ - fVar170 * 0.6931472;
                auVar82._0_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) *
                     (fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) * fVar171 * fVar171)
                     + 1.0;
                auVar82._4_4_ =
                     (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                     (fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175)
                     + 1.0;
                auVar82._8_4_ =
                     (float)((int)fVar169 * 0x800000 + 0x3f800000) *
                     (fVar176 + 1.0 +
                     (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176
                       + 0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176)
                     + 1.0;
                auVar82._12_4_ =
                     (float)((int)fVar170 * 0x800000 + 0x3f800000) *
                     (fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177)
                     + 1.0;
                auVar122 = maxps(auVar82,_DAT_00595310);
                fVar171 = (float)(auVar122._0_4_ & 0x807fffff | 0x3f000000);
                fVar176 = (float)(auVar122._4_4_ & 0x807fffff | 0x3f000000);
                fVar159 = (float)(auVar122._8_4_ & 0x807fffff | 0x3f000000);
                fVar169 = (float)(auVar122._12_4_ & 0x807fffff | 0x3f000000);
                fVar175 = fVar171 + -1.0 + (float)(-(uint)(fVar171 < 0.70710677) & (uint)fVar171);
                fVar177 = fVar176 + -1.0 + (float)(-(uint)(fVar176 < 0.70710677) & (uint)fVar176);
                fVar168 = fVar159 + -1.0 + (float)(-(uint)(fVar159 < 0.70710677) & (uint)fVar159);
                fVar170 = fVar169 + -1.0 + (float)(-(uint)(fVar169 < 0.70710677) & (uint)fVar169);
                auVar83._0_4_ =
                     ~-(uint)(auVar82._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar122._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar171 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar175 +
                            (((((((((fVar175 * 0.070376836 + -0.1151461) * fVar175 + 0.116769984) *
                                   fVar175 + -0.12420141) * fVar175 + 0.14249323) * fVar175 +
                                -0.16668057) * fVar175 + 0.20000714) * fVar175 + -0.24999994) *
                              fVar175 + 0.3333333) * fVar175 + -0.5) * fVar175 * fVar175) * -2.0);
                auVar83._4_4_ =
                     ~-(uint)(auVar82._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar122._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar176 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar177 +
                            (((((((((fVar177 * 0.070376836 + -0.1151461) * fVar177 + 0.116769984) *
                                   fVar177 + -0.12420141) * fVar177 + 0.14249323) * fVar177 +
                                -0.16668057) * fVar177 + 0.20000714) * fVar177 + -0.24999994) *
                              fVar177 + 0.3333333) * fVar177 + -0.5) * fVar177 * fVar177) * -2.0);
                auVar83._8_4_ =
                     ~-(uint)(auVar82._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar122._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar159 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar168 +
                            (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                   fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                                -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                              fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
                auVar83._12_4_ =
                     ~-(uint)(auVar82._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar122._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar169 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar170 +
                            (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) *
                                   fVar170 + -0.12420141) * fVar170 + 0.14249323) * fVar170 +
                                -0.16668057) * fVar170 + 0.20000714) * fVar170 + -0.24999994) *
                              fVar170 + 0.3333333) * fVar170 + -0.5) * fVar170 * fVar170) * -2.0);
                auVar65._0_8_ =
                     CONCAT44(-(uint)(auVar82._4_4_ <= 0.0),-(uint)(auVar82._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar65._8_4_ = -(uint)(auVar82._8_4_ <= 0.0) & 0x7fffffff;
                auVar65._12_4_ = -(uint)(auVar82._12_4_ <= 0.0) & 0x7fffffff;
                auVar122 = minps(auVar65 | auVar83,_DAT_00595260);
                auVar122 = maxps(auVar122,_DAT_00595270);
                fVar171 = auVar122._0_4_ * 1.442695 + 0.5;
                fVar175 = auVar122._4_4_ * 1.442695 + 0.5;
                fVar176 = auVar122._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar122._12_4_ * 1.442695 + 0.5;
                fVar159 = (float)(int)fVar171;
                fVar168 = (float)(int)fVar175;
                fVar169 = (float)(int)fVar176;
                fVar170 = (float)(int)fVar177;
                fVar159 = fVar159 - (float)(-(uint)(fVar171 < fVar159) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar175 < fVar168) & 0x3f800000);
                fVar169 = fVar169 - (float)(-(uint)(fVar176 < fVar169) & 0x3f800000);
                fVar170 = fVar170 - (float)(-(uint)(fVar177 < fVar170) & 0x3f800000);
                fVar171 = auVar122._0_4_ - fVar159 * 0.6931472;
                fVar175 = auVar122._4_4_ - fVar168 * 0.6931472;
                fVar176 = auVar122._8_4_ - fVar169 * 0.6931472;
                fVar177 = auVar122._12_4_ - fVar170 * 0.6931472;
                auVar66._0_4_ =
                     fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) * fVar171 * fVar171;
                auVar66._4_4_ =
                     fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
                auVar66._8_4_ =
                     fVar176 + 1.0 +
                     (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176
                       + 0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176;
                auVar66._12_4_ =
                     fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
                auVar108._0_4_ = (float)((int)fVar159 * 0x800000 + 0x3f800000) * auVar66._0_4_ + 1.0
                ;
                auVar108._4_4_ = (float)((int)fVar168 * 0x800000 + 0x3f800000) * auVar66._4_4_ + 1.0
                ;
                auVar108._8_4_ = (float)((int)fVar169 * 0x800000 + 0x3f800000) * auVar66._8_4_ + 1.0
                ;
                auVar108._12_4_ =
                     (float)((int)fVar170 * 0x800000 + 0x3f800000) * auVar66._12_4_ + 1.0;
                auVar122 = rcpps(auVar66,auVar108);
                fVar171 = auVar122._0_4_;
                fVar175 = auVar122._4_4_;
                fVar176 = auVar122._8_4_;
                fVar177 = auVar122._12_4_;
                auVar54._0_4_ =
                     auVar106._0_4_ *
                     (fVar171 + fVar171 + -1.0 +
                     (2.0 - auVar108._0_4_ * (fVar171 + fVar171)) * fVar171);
                auVar54._4_4_ =
                     fVar58 * (fVar175 + fVar175 + -1.0 +
                              (2.0 - auVar108._4_4_ * (fVar175 + fVar175)) * fVar175);
                auVar54._8_4_ =
                     fVar59 * (fVar176 + fVar176 + -1.0 +
                              (2.0 - auVar108._8_4_ * (fVar176 + fVar176)) * fVar176);
                auVar54._12_4_ =
                     fVar60 * (fVar177 + fVar177 + -1.0 +
                              (2.0 - auVar108._12_4_ * (fVar177 + fVar177)) * fVar177);
                break;
              case 6:
                fVar171 = **(float **)(&this->field_0xe8 + (long)local_a0);
                fVar175 = (*(float **)(&this->field_0xe8 + (long)local_a0))[1];
                auVar69._0_4_ = fVar171 * auVar106._0_4_ + fVar175;
                auVar69._4_4_ = fVar171 * fVar58 + fVar175;
                auVar69._8_4_ = fVar171 * fVar59 + fVar175;
                auVar69._12_4_ = fVar171 * fVar60 + fVar175;
                auVar122 = maxps(auVar69,_DAT_00592030);
                auVar19._8_4_ = 0x3f800000;
                auVar19._0_8_ = 0x3f8000003f800000;
                auVar19._12_4_ = 0x3f800000;
                auVar122 = minps(auVar122,auVar19);
                auVar54._0_4_ = auVar106._0_4_ * auVar122._0_4_;
                auVar54._4_4_ = fVar58 * auVar122._4_4_;
                auVar54._8_4_ = fVar59 * auVar122._8_4_;
                auVar54._12_4_ = fVar60 * auVar122._12_4_;
              }
              *pauVar31 = auVar54;
              pauVar31 = pauVar31 + 1;
              uVar35 = uVar35 + 1;
            } while (uVar35 != local_88);
          }
          if ((iVar9 == 4 && 0 < (long)uVar44) && bVar33 == 0) {
            pauVar31 = (undefined1 (*) [16])
                       (top_blob->w * local_140 * top_blob->elemsize + (long)top_blob->data);
            uVar35 = 0;
            do {
              auVar86 = ZEXT816(0);
              auVar70 = ZEXT816(0);
              if (lVar10 != 0) {
                uVar6 = *(undefined4 *)(lVar10 + uVar35 * 4);
                auVar70._4_4_ = (float)uVar6;
                auVar70._0_4_ = (float)uVar6;
                auVar70._8_4_ = (float)uVar6;
                auVar70._12_4_ = (float)uVar6;
              }
              pfVar40 = (float *)(uVar35 * (long)(int)uVar34 * 4 + (long)(this->weight_data_tm).data
                                 );
              pauVar45 = (undefined1 (*) [16])
                         (bottom_blob->w * local_140 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              uVar47 = 0;
              if ((int)uVar34 < 4) {
                auVar106._0_4_ = 0.0;
                fVar58 = 0.0;
                fVar59 = 0.0;
                fVar60 = 0.0;
                auVar109 = ZEXT816(0);
              }
              else {
                iVar38 = 3;
                auVar106._0_4_ = 0.0;
                fVar58 = 0.0;
                fVar59 = 0.0;
                fVar60 = 0.0;
                auVar122 = auVar70;
                auVar123 = auVar86;
                auVar120 = ZEXT816(0);
                do {
                  auVar167 = *pauVar45;
                  auVar98 = pauVar45[1];
                  fVar171 = *pfVar40;
                  fVar175 = pfVar40[1];
                  fVar176 = pfVar40[2];
                  fVar177 = pfVar40[3];
                  auVar70._0_4_ = auVar122._0_4_ + fVar171 * auVar167._0_4_;
                  auVar70._4_4_ = auVar122._4_4_ + fVar171 * auVar167._4_4_;
                  auVar70._8_4_ = auVar122._8_4_ + fVar171 * auVar167._8_4_;
                  auVar70._12_4_ = auVar122._12_4_ + fVar171 * auVar167._12_4_;
                  auVar109._0_4_ = auVar120._0_4_ + fVar175 * auVar98._0_4_;
                  auVar109._4_4_ = auVar120._4_4_ + fVar175 * auVar98._4_4_;
                  auVar109._8_4_ = auVar120._8_4_ + fVar175 * auVar98._8_4_;
                  auVar109._12_4_ = auVar120._12_4_ + fVar175 * auVar98._12_4_;
                  auVar106._0_4_ = auVar106._0_4_ + fVar176 * *(float *)pauVar45[2];
                  fVar58 = fVar58 + fVar176 * *(float *)(pauVar45[2] + 4);
                  fVar59 = fVar59 + fVar176 * *(float *)(pauVar45[2] + 8);
                  fVar60 = fVar60 + fVar176 * *(float *)(pauVar45[2] + 0xc);
                  auVar86._0_4_ = auVar123._0_4_ + fVar177 * *(float *)pauVar45[3];
                  auVar86._4_4_ = auVar123._4_4_ + fVar177 * *(float *)(pauVar45[3] + 4);
                  auVar86._8_4_ = auVar123._8_4_ + fVar177 * *(float *)(pauVar45[3] + 8);
                  auVar86._12_4_ = auVar123._12_4_ + fVar177 * *(float *)(pauVar45[3] + 0xc);
                  pauVar45 = pauVar45 + 4;
                  pfVar40 = pfVar40 + 4;
                  iVar38 = iVar38 + 4;
                  auVar122 = auVar70;
                  auVar123 = auVar86;
                  auVar120 = auVar109;
                } while (iVar38 < (int)uVar34);
                uVar47 = uVar34 & 0xfffffffc;
              }
              if ((int)uVar47 < (int)uVar34) {
                lVar39 = 0;
                auVar122 = auVar70;
                do {
                  auVar123 = *pauVar45;
                  fVar171 = pfVar40[lVar39];
                  auVar70._0_4_ = auVar122._0_4_ + fVar171 * auVar123._0_4_;
                  auVar70._4_4_ = auVar122._4_4_ + fVar171 * auVar123._4_4_;
                  auVar70._8_4_ = auVar122._8_4_ + fVar171 * auVar123._8_4_;
                  auVar70._12_4_ = auVar122._12_4_ + fVar171 * auVar123._12_4_;
                  pauVar45 = pauVar45 + 1;
                  lVar39 = lVar39 + 1;
                  auVar122 = auVar70;
                } while (uVar34 - uVar47 != (int)lVar39);
              }
              auVar106._0_4_ = auVar106._0_4_ + auVar86._0_4_ + auVar109._0_4_ + auVar70._0_4_;
              fVar58 = fVar58 + auVar86._4_4_ + auVar109._4_4_ + auVar70._4_4_;
              auVar56._0_8_ = CONCAT44(fVar58,auVar106._0_4_);
              auVar56._8_4_ = fVar59 + auVar86._8_4_ + auVar109._8_4_ + auVar70._8_4_;
              auVar56._12_4_ = fVar60 + auVar86._12_4_ + auVar109._12_4_ + auVar70._12_4_;
              switch(iVar30) {
              case 1:
                auVar56 = maxps(auVar56,_DAT_00592030);
                break;
              case 2:
                auVar76._8_4_ = auVar56._8_4_;
                auVar76._0_8_ = auVar56._0_8_;
                auVar76._12_4_ = auVar56._12_4_;
                auVar123 = maxps(auVar76,ZEXT816(0));
                auVar122 = minps(auVar56,ZEXT816(0));
                auVar106._0_4_ = **(float **)(&this->field_0xe8 + (long)local_a0);
                auVar56._4_4_ = auVar106._0_4_ * auVar122._4_4_ + auVar123._4_4_;
                auVar56._0_4_ = auVar106._0_4_ * auVar122._0_4_ + auVar123._0_4_;
                auVar56._8_4_ = auVar106._0_4_ * auVar122._8_4_ + auVar123._8_4_;
                auVar56._12_4_ = auVar106._0_4_ * auVar122._12_4_ + auVar123._12_4_;
                break;
              case 3:
                uVar6 = **(undefined4 **)(&this->field_0xe8 + (long)local_a0);
                uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)local_a0))[1];
                auVar74._4_4_ = uVar6;
                auVar74._0_4_ = uVar6;
                auVar74._8_4_ = uVar6;
                auVar74._12_4_ = uVar6;
                auVar89._4_4_ = uVar5;
                auVar89._0_4_ = uVar5;
                auVar89._8_4_ = uVar5;
                auVar89._12_4_ = uVar5;
                auVar122 = maxps(auVar56,auVar74);
                auVar56 = minps(auVar122,auVar89);
                break;
              case 4:
                auVar57._0_8_ = CONCAT44(fVar58,auVar106._0_4_) ^ 0x8000000080000000;
                auVar57._8_4_ = -auVar56._8_4_;
                auVar57._12_4_ = -auVar56._12_4_;
                auVar122 = minps(auVar57,_DAT_00595260);
                auVar122 = maxps(auVar122,_DAT_00595270);
                fVar58 = auVar122._0_4_ * 1.442695 + 0.5;
                fVar60 = auVar122._4_4_ * 1.442695 + 0.5;
                fVar175 = auVar122._8_4_ * 1.442695 + 0.5;
                fVar177 = auVar122._12_4_ * 1.442695 + 0.5;
                auVar106._0_4_ = (float)(int)fVar58;
                fVar59 = (float)(int)fVar60;
                fVar171 = (float)(int)fVar175;
                fVar176 = (float)(int)fVar177;
                auVar106._0_4_ =
                     auVar106._0_4_ - (float)(-(uint)(fVar58 < auVar106._0_4_) & 0x3f800000);
                fVar59 = fVar59 - (float)(-(uint)(fVar60 < fVar59) & 0x3f800000);
                fVar171 = fVar171 - (float)(-(uint)(fVar175 < fVar171) & 0x3f800000);
                fVar176 = fVar176 - (float)(-(uint)(fVar177 < fVar176) & 0x3f800000);
                fVar58 = auVar106._0_4_ * -0.6931472 + auVar122._0_4_;
                fVar60 = fVar59 * -0.6931472 + auVar122._4_4_;
                fVar175 = fVar171 * -0.6931472 + auVar122._8_4_;
                fVar177 = fVar176 * -0.6931472 + auVar122._12_4_;
                auVar75._0_4_ =
                     fVar58 + 1.0 +
                     (((((fVar58 * 0.00019875691 + 0.0013981999) * fVar58 + 0.008333452) * fVar58 +
                       0.041665796) * fVar58 + 0.16666666) * fVar58 + 0.5) * fVar58 * fVar58;
                auVar75._4_4_ =
                     fVar60 + 1.0 +
                     (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                       0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60;
                auVar75._8_4_ =
                     fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
                auVar75._12_4_ =
                     fVar177 + 1.0 +
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
                auVar90._0_4_ =
                     (float)((int)auVar106._0_4_ * 0x800000 + 0x3f800000) * auVar75._0_4_ + 1.0;
                auVar90._4_4_ = (float)((int)fVar59 * 0x800000 + 0x3f800000) * auVar75._4_4_ + 1.0;
                auVar90._8_4_ = (float)((int)fVar171 * 0x800000 + 0x3f800000) * auVar75._8_4_ + 1.0;
                auVar90._12_4_ =
                     (float)((int)fVar176 * 0x800000 + 0x3f800000) * auVar75._12_4_ + 1.0;
                auVar122 = rcpps(auVar75,auVar90);
                auVar106._0_4_ = auVar122._0_4_;
                fVar58 = auVar122._4_4_;
                fVar59 = auVar122._8_4_;
                fVar60 = auVar122._12_4_;
                auVar56._0_4_ =
                     (1.0 - auVar90._0_4_ * auVar106._0_4_) * auVar106._0_4_ + auVar106._0_4_;
                auVar56._4_4_ = (1.0 - auVar90._4_4_ * fVar58) * fVar58 + fVar58;
                auVar56._8_4_ = (1.0 - auVar90._8_4_ * fVar59) * fVar59 + fVar59;
                auVar56._12_4_ = (1.0 - auVar90._12_4_ * fVar60) * fVar60 + fVar60;
                break;
              case 5:
                auVar71._8_4_ = auVar56._8_4_;
                auVar71._0_8_ = auVar56._0_8_;
                auVar71._12_4_ = auVar56._12_4_;
                auVar122 = minps(auVar71,_DAT_00595260);
                auVar122 = maxps(auVar122,_DAT_00595270);
                fVar59 = auVar122._0_4_ * 1.442695 + 0.5;
                fVar60 = auVar122._4_4_ * 1.442695 + 0.5;
                fVar171 = auVar122._8_4_ * 1.442695 + 0.5;
                fVar175 = auVar122._12_4_ * 1.442695 + 0.5;
                fVar176 = (float)(int)fVar59;
                fVar177 = (float)(int)fVar60;
                fVar159 = (float)(int)fVar171;
                fVar168 = (float)(int)fVar175;
                fVar176 = fVar176 - (float)(-(uint)(fVar59 < fVar176) & 0x3f800000);
                fVar177 = fVar177 - (float)(-(uint)(fVar60 < fVar177) & 0x3f800000);
                fVar159 = fVar159 - (float)(-(uint)(fVar171 < fVar159) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar175 < fVar168) & 0x3f800000);
                fVar59 = auVar122._0_4_ - fVar176 * 0.6931472;
                fVar60 = auVar122._4_4_ - fVar177 * 0.6931472;
                fVar171 = auVar122._8_4_ - fVar159 * 0.6931472;
                fVar175 = auVar122._12_4_ - fVar168 * 0.6931472;
                auVar87._0_4_ =
                     (float)((int)fVar176 * 0x800000 + 0x3f800000) *
                     (fVar59 + 1.0 +
                     (((((fVar59 * 0.00019875691 + 0.0013981999) * fVar59 + 0.008333452) * fVar59 +
                       0.041665796) * fVar59 + 0.16666666) * fVar59 + 0.5) * fVar59 * fVar59) + 1.0;
                auVar87._4_4_ =
                     (float)((int)fVar177 * 0x800000 + 0x3f800000) *
                     (fVar60 + 1.0 +
                     (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                       0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60) + 1.0;
                auVar87._8_4_ =
                     (float)((int)fVar159 * 0x800000 + 0x3f800000) *
                     (fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) * fVar171 * fVar171)
                     + 1.0;
                auVar87._12_4_ =
                     (float)((int)fVar168 * 0x800000 + 0x3f800000) *
                     (fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175)
                     + 1.0;
                auVar122 = maxps(auVar87,_DAT_00595310);
                fVar59 = (float)(auVar122._0_4_ & 0x807fffff | 0x3f000000);
                fVar171 = (float)(auVar122._4_4_ & 0x807fffff | 0x3f000000);
                fVar176 = (float)(auVar122._8_4_ & 0x807fffff | 0x3f000000);
                fVar159 = (float)(auVar122._12_4_ & 0x807fffff | 0x3f000000);
                fVar60 = fVar59 + -1.0 + (float)(-(uint)(fVar59 < 0.70710677) & (uint)fVar59);
                fVar175 = fVar171 + -1.0 + (float)(-(uint)(fVar171 < 0.70710677) & (uint)fVar171);
                fVar177 = fVar176 + -1.0 + (float)(-(uint)(fVar176 < 0.70710677) & (uint)fVar176);
                fVar168 = fVar159 + -1.0 + (float)(-(uint)(fVar159 < 0.70710677) & (uint)fVar159);
                auVar88._0_4_ =
                     ~-(uint)(auVar87._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar122._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar59 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar60 + (((((((((fVar60 * 0.070376836 + -0.1151461) * fVar60 +
                                             0.116769984) * fVar60 + -0.12420141) * fVar60 +
                                           0.14249323) * fVar60 + -0.16668057) * fVar60 + 0.20000714
                                         ) * fVar60 + -0.24999994) * fVar60 + 0.3333333) * fVar60 +
                                      -0.5) * fVar60 * fVar60) * -2.0);
                auVar88._4_4_ =
                     ~-(uint)(auVar87._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar122._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar171 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar175 +
                            (((((((((fVar175 * 0.070376836 + -0.1151461) * fVar175 + 0.116769984) *
                                   fVar175 + -0.12420141) * fVar175 + 0.14249323) * fVar175 +
                                -0.16668057) * fVar175 + 0.20000714) * fVar175 + -0.24999994) *
                              fVar175 + 0.3333333) * fVar175 + -0.5) * fVar175 * fVar175) * -2.0);
                auVar88._8_4_ =
                     ~-(uint)(auVar87._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar122._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar176 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar177 +
                            (((((((((fVar177 * 0.070376836 + -0.1151461) * fVar177 + 0.116769984) *
                                   fVar177 + -0.12420141) * fVar177 + 0.14249323) * fVar177 +
                                -0.16668057) * fVar177 + 0.20000714) * fVar177 + -0.24999994) *
                              fVar177 + 0.3333333) * fVar177 + -0.5) * fVar177 * fVar177) * -2.0);
                auVar88._12_4_ =
                     ~-(uint)(auVar87._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar122._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar159 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar168 +
                            (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                   fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                                -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                              fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
                auVar72._0_8_ =
                     CONCAT44(-(uint)(auVar87._4_4_ <= 0.0),-(uint)(auVar87._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar72._8_4_ = -(uint)(auVar87._8_4_ <= 0.0) & 0x7fffffff;
                auVar72._12_4_ = -(uint)(auVar87._12_4_ <= 0.0) & 0x7fffffff;
                auVar122 = minps(auVar72 | auVar88,_DAT_00595260);
                auVar122 = maxps(auVar122,_DAT_00595270);
                fVar59 = auVar122._0_4_ * 1.442695 + 0.5;
                fVar60 = auVar122._4_4_ * 1.442695 + 0.5;
                fVar171 = auVar122._8_4_ * 1.442695 + 0.5;
                fVar175 = auVar122._12_4_ * 1.442695 + 0.5;
                fVar176 = (float)(int)fVar59;
                fVar177 = (float)(int)fVar60;
                fVar159 = (float)(int)fVar171;
                fVar168 = (float)(int)fVar175;
                fVar176 = fVar176 - (float)(-(uint)(fVar59 < fVar176) & 0x3f800000);
                fVar177 = fVar177 - (float)(-(uint)(fVar60 < fVar177) & 0x3f800000);
                fVar159 = fVar159 - (float)(-(uint)(fVar171 < fVar159) & 0x3f800000);
                fVar168 = fVar168 - (float)(-(uint)(fVar175 < fVar168) & 0x3f800000);
                fVar59 = auVar122._0_4_ - fVar176 * 0.6931472;
                fVar60 = auVar122._4_4_ - fVar177 * 0.6931472;
                fVar171 = auVar122._8_4_ - fVar159 * 0.6931472;
                fVar175 = auVar122._12_4_ - fVar168 * 0.6931472;
                auVar73._0_4_ =
                     fVar59 + 1.0 +
                     (((((fVar59 * 0.00019875691 + 0.0013981999) * fVar59 + 0.008333452) * fVar59 +
                       0.041665796) * fVar59 + 0.16666666) * fVar59 + 0.5) * fVar59 * fVar59;
                auVar73._4_4_ =
                     fVar60 + 1.0 +
                     (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                       0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) * fVar60 * fVar60;
                auVar73._8_4_ =
                     fVar171 + 1.0 +
                     (((((fVar171 * 0.00019875691 + 0.0013981999) * fVar171 + 0.008333452) * fVar171
                       + 0.041665796) * fVar171 + 0.16666666) * fVar171 + 0.5) * fVar171 * fVar171;
                auVar73._12_4_ =
                     fVar175 + 1.0 +
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
                auVar110._0_4_ = (float)((int)fVar176 * 0x800000 + 0x3f800000) * auVar73._0_4_ + 1.0
                ;
                auVar110._4_4_ = (float)((int)fVar177 * 0x800000 + 0x3f800000) * auVar73._4_4_ + 1.0
                ;
                auVar110._8_4_ = (float)((int)fVar159 * 0x800000 + 0x3f800000) * auVar73._8_4_ + 1.0
                ;
                auVar110._12_4_ =
                     (float)((int)fVar168 * 0x800000 + 0x3f800000) * auVar73._12_4_ + 1.0;
                auVar122 = rcpps(auVar73,auVar110);
                fVar59 = auVar122._0_4_;
                fVar60 = auVar122._4_4_;
                fVar171 = auVar122._8_4_;
                fVar175 = auVar122._12_4_;
                auVar56._0_4_ =
                     auVar106._0_4_ *
                     (fVar59 + fVar59 + -1.0 + (2.0 - auVar110._0_4_ * (fVar59 + fVar59)) * fVar59);
                auVar56._4_4_ =
                     fVar58 * (fVar60 + fVar60 + -1.0 +
                              (2.0 - auVar110._4_4_ * (fVar60 + fVar60)) * fVar60);
                auVar56._8_4_ =
                     auVar56._8_4_ *
                     (fVar171 + fVar171 + -1.0 +
                     (2.0 - auVar110._8_4_ * (fVar171 + fVar171)) * fVar171);
                auVar56._12_4_ =
                     auVar56._12_4_ *
                     (fVar175 + fVar175 + -1.0 +
                     (2.0 - auVar110._12_4_ * (fVar175 + fVar175)) * fVar175);
                break;
              case 6:
                fVar59 = **(float **)(&this->field_0xe8 + (long)local_a0);
                fVar60 = (*(float **)(&this->field_0xe8 + (long)local_a0))[1];
                auVar77._0_4_ = fVar59 * auVar106._0_4_ + fVar60;
                auVar77._4_4_ = fVar59 * fVar58 + fVar60;
                auVar77._8_4_ = fVar59 * auVar56._8_4_ + fVar60;
                auVar77._12_4_ = fVar59 * auVar56._12_4_ + fVar60;
                auVar122 = maxps(auVar77,_DAT_00592030);
                auVar20._8_4_ = 0x3f800000;
                auVar20._0_8_ = 0x3f8000003f800000;
                auVar20._12_4_ = 0x3f800000;
                auVar122 = minps(auVar122,auVar20);
                auVar56._0_4_ = auVar106._0_4_ * auVar122._0_4_;
                auVar56._4_4_ = fVar58 * auVar122._4_4_;
                auVar56._8_4_ = auVar56._8_4_ * auVar122._8_4_;
                auVar56._12_4_ = auVar56._12_4_ * auVar122._12_4_;
              }
              *pauVar31 = auVar56;
              pauVar31 = pauVar31 + 1;
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar44);
          }
          if ((iVar9 == 1 && 0 < (long)uVar44) && bVar33 == 0) {
            pfVar42 = (float *)(top_blob->w * local_140 * top_blob->elemsize + (long)top_blob->data)
            ;
            pvVar11 = (this->weight_data_tm).data;
            pfVar51 = (float *)(bottom_blob->w * local_140 * bottom_blob->elemsize +
                               (long)bottom_blob->data);
            pfVar40 = *(float **)(&this->field_0xe8 + (long)local_a0);
            uVar35 = 0;
            do {
              if (lVar10 == 0) {
                auVar106._0_4_ = 0.0;
              }
              else {
                auVar106._0_4_ = *(float *)(lVar10 + uVar35 * 4);
              }
              pfVar32 = (float *)(uVar35 * (long)(int)uVar34 * 4 + (long)pvVar11);
              pfVar36 = pfVar51;
              if ((int)uVar34 < 4) {
                uVar47 = 0;
                auVar78 = ZEXT816(0);
              }
              else {
                iVar38 = 3;
                auVar122 = ZEXT816(0);
                do {
                  auVar78._0_4_ = auVar122._0_4_ + *pfVar32 * *pfVar36;
                  auVar78._4_4_ = auVar122._4_4_ + pfVar32[1] * pfVar36[1];
                  auVar78._8_4_ = auVar122._8_4_ + pfVar32[2] * pfVar36[2];
                  auVar78._12_4_ = auVar122._12_4_ + pfVar32[3] * pfVar36[3];
                  pfVar36 = pfVar36 + 4;
                  pfVar32 = pfVar32 + 4;
                  iVar38 = iVar38 + 4;
                  auVar122 = auVar78;
                } while (iVar38 < (int)uVar34);
                uVar47 = uVar34 & 0xfffffffc;
              }
              if ((int)uVar47 < (int)uVar34) {
                lVar39 = 0;
                do {
                  auVar106._0_4_ = auVar106._0_4_ + pfVar32[lVar39] * pfVar36[lVar39];
                  lVar39 = lVar39 + 1;
                } while (uVar34 - uVar47 != (int)lVar39);
              }
              fVar58 = auVar78._12_4_ + auVar78._4_4_;
              auVar140._4_4_ = fVar58;
              auVar140._0_4_ = fVar58;
              auVar140._8_4_ = fVar58;
              auVar140._12_4_ = fVar58;
              auVar106._4_12_ = auVar140._4_12_;
              auVar106._0_4_ = fVar58 + auVar78._8_4_ + auVar78._0_4_ + auVar106._0_4_;
              switch(iVar30) {
              case 1:
                if (auVar106._0_4_ <= 0.0) {
                  auVar22._12_4_ = 0;
                  auVar22._0_12_ = auVar106._4_12_;
                  auVar106 = auVar22 << 0x20;
                }
              default:
switchD_002ac0bd_default:
                fVar58 = auVar106._0_4_;
                break;
              case 2:
                fVar58 = (float)(~-(uint)(0.0 < auVar106._0_4_) & (uint)*pfVar40 |
                                -(uint)(0.0 < auVar106._0_4_) & 0x3f800000) * auVar106._0_4_;
                break;
              case 3:
                if (auVar106._0_4_ <= *pfVar40) {
                  auVar106._0_4_ = *pfVar40;
                }
                fVar58 = pfVar40[1];
                if (auVar106._0_4_ <= fVar58) {
                  fVar58 = auVar106._0_4_;
                }
                break;
              case 4:
                if (88.37626 <= auVar106._0_4_) {
                  auVar106._0_4_ = 88.37626;
                }
                auVar106._0_4_ =
                     expf((float)(-(uint)(auVar106._0_4_ < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(auVar106._0_4_ < -88.37626) & (uint)-auVar106._0_4_));
                fVar58 = 1.0 / (auVar106._0_4_ + 1.0);
                break;
              case 5:
                local_98 = auVar106;
                auVar106._0_4_ = expf(auVar106._0_4_);
                auVar106._0_4_ = logf(auVar106._0_4_ + 1.0);
                auVar106._0_4_ = tanhf(auVar106._0_4_);
                fVar58 = auVar106._0_4_ * (float)local_98._0_4_;
                break;
              case 6:
                fVar59 = *pfVar40;
                fVar60 = -pfVar40[1] / fVar59;
                fVar58 = 0.0;
                if (fVar60 <= auVar106._0_4_) {
                  if (fVar60 + 1.0 / fVar59 < auVar106._0_4_) goto switchD_002ac0bd_default;
                  fVar58 = (fVar59 * auVar106._0_4_ + pfVar40[1]) * auVar106._0_4_;
                }
              }
              *pfVar42 = fVar58;
              pfVar42 = pfVar42 + 1;
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar44);
          }
          local_140 = local_140 + 1;
        } while (local_140 != local_80);
      }
      iVar30 = 0;
    }
  }
  else {
    local_e8 = (float *)bottom_blob->data;
    piVar12 = bottom_blob->refcount;
    uStack_e0 = SUB84(piVar12,0);
    uStack_dc = (undefined4)((ulong)piVar12 >> 0x20);
    local_d8 = (undefined4)bottom_blob->elemsize;
    uStack_d4 = (undefined4)(bottom_blob->elemsize >> 0x20);
    local_d0 = bottom_blob->elempack;
    local_c8 = bottom_blob->allocator;
    uVar26 = bottom_blob->w;
    uVar27 = bottom_blob->h;
    uVar28 = bottom_blob->d;
    uVar29 = bottom_blob->c;
    local_a8 = bottom_blob->cstep;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + 1;
      UNLOCK();
    }
    iStack_bc = uVar26;
    uStack_b8 = uVar27;
    uStack_b4 = uVar28;
    uStack_b0 = uVar29;
    if (bottom_blob->dims != 1) {
      local_78._0_1_ = opt->lightmode;
      local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
      local_78._4_4_ = opt->num_threads;
      local_68 = opt->workspace_allocator;
      uStack_60._0_4_ = opt->openmp_blocktime;
      uStack_60._4_1_ = opt->use_winograd_convolution;
      uStack_60._5_1_ = opt->use_sgemm_convolution;
      uStack_60._6_1_ = opt->use_int8_inference;
      uStack_60._7_1_ = opt->use_vulkan_compute;
      local_58[0] = opt->use_bf16_storage;
      local_58[1] = opt->use_fp16_packed;
      local_58[2] = opt->use_fp16_storage;
      local_58[3] = opt->use_fp16_arithmetic;
      local_58[4] = opt->use_int8_packed;
      local_58[5] = opt->use_int8_storage;
      local_58[6] = opt->use_int8_arithmetic;
      local_58[7] = opt->use_packing_layout;
      local_58[8] = opt->use_shader_pack8;
      local_58[9] = opt->use_subgroup_basic;
      local_58[10] = opt->use_subgroup_vote;
      local_58[0xb] = opt->use_subgroup_ballot;
      local_58[0xc] = opt->use_subgroup_shuffle;
      local_58[0xd] = opt->use_image_storage;
      local_58[0xe] = opt->use_tensor_storage;
      local_58[0xf] = opt->use_reserved_0;
      local_48._0_4_ = opt->flush_denormals;
      local_48[4] = opt->use_local_pool_allocator;
      local_48[5] = opt->use_shader_local_memory;
      local_48[6] = opt->use_cooperative_matrix;
      local_48[7] = opt->use_winograd23_convolution;
      local_48[8] = opt->use_winograd43_convolution;
      local_48[9] = opt->use_winograd63_convolution;
      local_48[10] = opt->use_a53_a55_optimized_kernel;
      local_48[0xb] = opt->use_reserved_7;
      local_48[0xc] = opt->use_reserved_8;
      local_48[0xd] = opt->use_reserved_9;
      local_48[0xe] = opt->use_reserved_10;
      local_48[0xf] = opt->use_reserved_11;
      pAStack_70 = opt->workspace_allocator;
      (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_e8);
    }
    uVar34 = 1;
    if (opt->use_packing_layout == true) {
      uVar34 = (uint)(((&this->field_0xd0)[(long)this->_vptr_InnerProduct_x86[-3]] & 3) == 0) * 3 +
               1;
    }
    Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]) /
                         (int)uVar34,
                (ulong)uVar34 * (CONCAT44(uStack_d4,local_d8) / (ulong)(long)local_d0),uVar34,
                opt->blob_allocator);
    pfVar40 = local_e8;
    auVar122 = _DAT_005952a0;
    iVar30 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var13 = this->_vptr_InnerProduct_x86[-3];
      uVar6 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var13);
      uVar43 = local_d0 * iStack_bc;
      uVar34 = top_blob->w;
      lVar10 = *(long *)(&this->field_0x178 + (long)p_Var13);
      iVar30 = 0;
      auVar106._0_4_ = (float)DAT_005952a0;
      fVar58 = DAT_005952a0._4_4_;
      fVar59 = DAT_005952a0._8_4_;
      fVar60 = DAT_005952a0._12_4_;
      if (top_blob->elempack == 1) {
        lVar39 = (long)(int)uVar43;
        if (0 < (int)uVar34 >> 2) {
          local_98._0_4_ = uVar43 & 0xfffffffc;
          lVar37 = lVar39 * 0x10;
          lVar46 = lVar39 * 4;
          lVar48 = lVar39 * 0xc;
          lVar49 = lVar39 * 8;
          lVar50 = 0;
          uVar44 = 0;
          do {
            uVar35 = uVar44 * 4;
            fVar171 = 0.0;
            fVar175 = 0.0;
            fVar176 = 0.0;
            fVar177 = 0.0;
            if (lVar10 != 0) {
              pfVar42 = (float *)(lVar10 + uVar44 * 0x10);
              fVar171 = *pfVar42;
              fVar175 = pfVar42[1];
              fVar176 = pfVar42[2];
              fVar177 = pfVar42[3];
            }
            pvVar11 = (this->weight_data_tm).data;
            if ((int)uVar43 < 4) {
              uVar47 = 0;
              lVar1 = uVar35 * lVar39 * 4;
              lVar2 = (uVar35 | 1) * lVar39 * 4;
              lVar3 = (uVar35 | 2) * lVar39 * 4;
              lVar4 = (uVar35 | 3) * lVar39 * 4;
              fVar159 = 0.0;
              fVar168 = 0.0;
              fVar169 = 0.0;
              fVar170 = 0.0;
              fVar178 = 0.0;
              fVar179 = 0.0;
              fVar180 = 0.0;
              fVar181 = 0.0;
              fVar182 = 0.0;
              fVar184 = 0.0;
              fVar186 = 0.0;
              fVar188 = 0.0;
              fVar183 = 0.0;
              fVar185 = 0.0;
              fVar187 = 0.0;
              fVar189 = 0.0;
              pfVar42 = local_e8;
            }
            else {
              fVar183 = 0.0;
              fVar185 = 0.0;
              fVar187 = 0.0;
              fVar189 = 0.0;
              iVar30 = 3;
              lVar41 = 0;
              fVar182 = 0.0;
              fVar184 = 0.0;
              fVar186 = 0.0;
              fVar188 = 0.0;
              fVar178 = 0.0;
              fVar179 = 0.0;
              fVar180 = 0.0;
              fVar181 = 0.0;
              fVar159 = 0.0;
              fVar168 = 0.0;
              fVar169 = 0.0;
              fVar170 = 0.0;
              do {
                pfVar42 = (float *)((long)local_e8 + lVar41);
                fVar8 = *pfVar42;
                fVar23 = pfVar42[1];
                fVar24 = pfVar42[2];
                fVar25 = pfVar42[3];
                pfVar42 = (float *)((long)pvVar11 + lVar41 + lVar50);
                pfVar51 = (float *)((long)pvVar11 + lVar41 + lVar46);
                pfVar36 = (float *)((long)pvVar11 + lVar41 + lVar49);
                pfVar32 = (float *)((long)pvVar11 + lVar41 + lVar48);
                fVar183 = fVar183 + *pfVar42 * fVar8;
                fVar185 = fVar185 + pfVar42[1] * fVar23;
                fVar187 = fVar187 + pfVar42[2] * fVar24;
                fVar189 = fVar189 + pfVar42[3] * fVar25;
                fVar159 = fVar159 + *pfVar51 * fVar8;
                fVar168 = fVar168 + pfVar51[1] * fVar23;
                fVar169 = fVar169 + pfVar51[2] * fVar24;
                fVar170 = fVar170 + pfVar51[3] * fVar25;
                fVar178 = fVar178 + *pfVar36 * fVar8;
                fVar179 = fVar179 + pfVar36[1] * fVar23;
                fVar180 = fVar180 + pfVar36[2] * fVar24;
                fVar181 = fVar181 + pfVar36[3] * fVar25;
                fVar182 = fVar182 + *pfVar32 * fVar8;
                fVar184 = fVar184 + pfVar32[1] * fVar23;
                fVar186 = fVar186 + pfVar32[2] * fVar24;
                fVar188 = fVar188 + pfVar32[3] * fVar25;
                lVar41 = lVar41 + 0x10;
                iVar30 = iVar30 + 4;
              } while (iVar30 < (int)uVar43);
              lVar1 = lVar41 + lVar50;
              lVar4 = lVar41 + lVar48;
              lVar3 = lVar41 + lVar49;
              lVar2 = lVar41 + lVar46;
              pfVar42 = (float *)((long)local_e8 + lVar41);
              uVar47 = uVar43 & 0xfffffffc;
            }
            if (uVar43 - uVar47 != 0 && (int)uVar47 <= (int)uVar43) {
              lVar41 = 0;
              do {
                fVar8 = pfVar42[lVar41];
                fVar171 = fVar171 + fVar8 * *(float *)((long)pvVar11 + lVar41 * 4 + lVar1);
                fVar175 = fVar175 + fVar8 * *(float *)((long)pvVar11 + lVar41 * 4 + lVar2);
                fVar176 = fVar176 + fVar8 * *(float *)((long)pvVar11 + lVar41 * 4 + lVar3);
                fVar177 = fVar177 + fVar8 * *(float *)((long)pvVar11 + lVar41 * 4 + lVar4);
                lVar41 = lVar41 + 1;
              } while (uVar43 - uVar47 != (int)lVar41);
            }
            fVar171 = fVar189 + fVar187 + fVar185 + fVar183 + fVar171;
            fVar175 = fVar170 + fVar169 + fVar168 + fVar159 + fVar175;
            auVar123._0_8_ = CONCAT44(fVar175,fVar171);
            auVar123._8_4_ = fVar181 + fVar180 + fVar179 + fVar178 + fVar176;
            auVar123._12_4_ = fVar188 + fVar186 + fVar184 + fVar182 + fVar177;
            switch(uVar6) {
            case 1:
              auVar123 = maxps(auVar123,ZEXT816(0));
              break;
            case 2:
              auVar103._8_4_ = auVar123._8_4_;
              auVar103._0_8_ = auVar123._0_8_;
              auVar103._12_4_ = auVar123._12_4_;
              auVar120 = maxps(auVar103,ZEXT816(0));
              auVar167 = minps(auVar123,ZEXT816(0));
              fVar171 = **(float **)(&this->field_0xe8 + (long)p_Var13);
              auVar123._4_4_ = fVar171 * auVar167._4_4_ + auVar120._4_4_;
              auVar123._0_4_ = fVar171 * auVar167._0_4_ + auVar120._0_4_;
              auVar123._8_4_ = fVar171 * auVar167._8_4_ + auVar120._8_4_;
              auVar123._12_4_ = fVar171 * auVar167._12_4_ + auVar120._12_4_;
              break;
            case 3:
              uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var13);
              uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var13))[1];
              auVar101._4_4_ = uVar5;
              auVar101._0_4_ = uVar5;
              auVar101._8_4_ = uVar5;
              auVar101._12_4_ = uVar5;
              auVar114._4_4_ = uVar7;
              auVar114._0_4_ = uVar7;
              auVar114._8_4_ = uVar7;
              auVar114._12_4_ = uVar7;
              auVar123 = maxps(auVar123,auVar101);
              auVar123 = minps(auVar123,auVar114);
              break;
            case 4:
              auVar166._0_8_ = CONCAT44(fVar175,fVar171) ^ 0x8000000080000000;
              auVar166._8_4_ = -auVar123._8_4_;
              auVar166._12_4_ = -auVar123._12_4_;
              auVar123 = minps(auVar166,_DAT_00595260);
              auVar123 = maxps(auVar123,_DAT_00595270);
              fVar175 = auVar123._0_4_ * 1.442695 + 0.5;
              fVar177 = auVar123._4_4_ * 1.442695 + 0.5;
              fVar168 = auVar123._8_4_ * 1.442695 + 0.5;
              fVar170 = auVar123._12_4_ * 1.442695 + 0.5;
              fVar171 = (float)(int)fVar175;
              fVar176 = (float)(int)fVar177;
              fVar159 = (float)(int)fVar168;
              fVar169 = (float)(int)fVar170;
              fVar171 = fVar171 - (float)(-(uint)(fVar175 < fVar171) & (uint)auVar106._0_4_);
              fVar176 = fVar176 - (float)(-(uint)(fVar177 < fVar176) & (uint)fVar58);
              fVar159 = fVar159 - (float)(-(uint)(fVar168 < fVar159) & (uint)fVar59);
              fVar169 = fVar169 - (float)(-(uint)(fVar170 < fVar169) & (uint)fVar60);
              fVar175 = fVar171 * -0.6931472 + auVar123._0_4_;
              fVar177 = fVar176 * -0.6931472 + auVar123._4_4_;
              fVar168 = fVar159 * -0.6931472 + auVar123._8_4_;
              fVar170 = fVar169 * -0.6931472 + auVar123._12_4_;
              auVar102._0_4_ =
                   fVar175 + auVar106._0_4_ +
                   (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175 +
                     0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
              auVar102._4_4_ =
                   fVar177 + fVar58 +
                   (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177 +
                     0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
              auVar102._8_4_ =
                   fVar168 + fVar59 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168;
              auVar102._12_4_ =
                   fVar170 + fVar60 +
                   (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170 +
                     0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5) * fVar170 * fVar170;
              auVar115._0_4_ =
                   (float)((int)fVar171 * 0x800000 + (int)auVar106._0_4_) * auVar102._0_4_ +
                   auVar106._0_4_;
              auVar115._4_4_ =
                   (float)((int)fVar176 * 0x800000 + (int)fVar58) * auVar102._4_4_ + fVar58;
              auVar115._8_4_ =
                   (float)((int)fVar159 * 0x800000 + (int)fVar59) * auVar102._8_4_ + fVar59;
              auVar115._12_4_ =
                   (float)((int)fVar169 * 0x800000 + (int)fVar60) * auVar102._12_4_ + fVar60;
              auVar123 = rcpps(auVar102,auVar115);
              fVar171 = auVar123._0_4_;
              fVar175 = auVar123._4_4_;
              fVar176 = auVar123._8_4_;
              fVar177 = auVar123._12_4_;
              auVar123._0_4_ = (auVar106._0_4_ - auVar115._0_4_ * fVar171) * fVar171 + fVar171;
              auVar123._4_4_ = (fVar58 - auVar115._4_4_ * fVar175) * fVar175 + fVar175;
              auVar123._8_4_ = (fVar59 - auVar115._8_4_ * fVar176) * fVar176 + fVar176;
              auVar123._12_4_ = (fVar60 - auVar115._12_4_ * fVar177) * fVar177 + fVar177;
              break;
            case 5:
              auVar173._8_4_ = auVar123._8_4_;
              auVar173._0_8_ = auVar123._0_8_;
              auVar173._12_4_ = auVar123._12_4_;
              auVar120 = minps(auVar173,_DAT_00595260);
              auVar120 = maxps(auVar120,_DAT_00595270);
              fVar176 = auVar120._0_4_ * 1.442695 + 0.5;
              fVar177 = auVar120._4_4_ * 1.442695 + 0.5;
              fVar159 = auVar120._8_4_ * 1.442695 + 0.5;
              fVar168 = auVar120._12_4_ * 1.442695 + 0.5;
              fVar169 = (float)(int)fVar176;
              fVar170 = (float)(int)fVar177;
              fVar178 = (float)(int)fVar159;
              fVar179 = (float)(int)fVar168;
              fVar169 = fVar169 - (float)(-(uint)(fVar176 < fVar169) & (uint)auVar106._0_4_);
              fVar170 = fVar170 - (float)(-(uint)(fVar177 < fVar170) & (uint)fVar58);
              fVar178 = fVar178 - (float)(-(uint)(fVar159 < fVar178) & (uint)fVar59);
              fVar179 = fVar179 - (float)(-(uint)(fVar168 < fVar179) & (uint)fVar60);
              fVar176 = auVar120._0_4_ - fVar169 * 0.6931472;
              fVar177 = auVar120._4_4_ - fVar170 * 0.6931472;
              fVar159 = auVar120._8_4_ - fVar178 * 0.6931472;
              fVar168 = auVar120._12_4_ - fVar179 * 0.6931472;
              auVar98._0_4_ =
                   (float)((int)fVar169 * 0x800000 + (int)auVar106._0_4_) *
                   (fVar176 + auVar106._0_4_ +
                   (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176 +
                     0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176) +
                   auVar106._0_4_;
              auVar98._4_4_ =
                   (float)((int)fVar170 * 0x800000 + (int)fVar58) *
                   (fVar177 + fVar58 +
                   (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177 +
                     0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177) +
                   fVar58;
              auVar98._8_4_ =
                   (float)((int)fVar178 * 0x800000 + (int)fVar59) *
                   (fVar159 + fVar59 +
                   (((((fVar159 * 0.00019875691 + 0.0013981999) * fVar159 + 0.008333452) * fVar159 +
                     0.041665796) * fVar159 + 0.16666666) * fVar159 + 0.5) * fVar159 * fVar159) +
                   fVar59;
              auVar98._12_4_ =
                   (float)((int)fVar179 * 0x800000 + (int)fVar60) *
                   (fVar168 + fVar60 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   fVar60;
              auVar120 = maxps(auVar98,_DAT_00595310);
              fVar176 = (float)(auVar120._0_4_ & 0x807fffff | 0x3f000000);
              fVar159 = (float)(auVar120._4_4_ & 0x807fffff | 0x3f000000);
              fVar169 = (float)(auVar120._8_4_ & 0x807fffff | 0x3f000000);
              fVar178 = (float)(auVar120._12_4_ & 0x807fffff | 0x3f000000);
              fVar177 = fVar176 + -1.0 + (float)(-(uint)(fVar176 < 0.70710677) & (uint)fVar176);
              fVar168 = fVar159 + -1.0 + (float)(-(uint)(fVar159 < 0.70710677) & (uint)fVar159);
              fVar170 = fVar169 + -1.0 + (float)(-(uint)(fVar169 < 0.70710677) & (uint)fVar169);
              fVar179 = fVar178 + -1.0 + (float)(-(uint)(fVar178 < 0.70710677) & (uint)fVar178);
              auVar99._0_4_ =
                   ~-(uint)(auVar98._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar120._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar176 < 0.70710677) & (uint)auVar106._0_4_)) *
                           0.6931472 + fVar177 +
                          (((((((((fVar177 * 0.070376836 + -0.1151461) * fVar177 + 0.116769984) *
                                 fVar177 + -0.12420141) * fVar177 + 0.14249323) * fVar177 +
                              -0.16668057) * fVar177 + 0.20000714) * fVar177 + -0.24999994) *
                            fVar177 + 0.3333333) * fVar177 + -0.5) * fVar177 * fVar177) * -2.0);
              auVar99._4_4_ =
                   ~-(uint)(auVar98._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar120._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar159 < 0.70710677) & (uint)fVar58)) * 0.6931472 +
                           fVar168 +
                          (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                 fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                              -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                            fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
              auVar99._8_4_ =
                   ~-(uint)(auVar98._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar120._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar169 < 0.70710677) & (uint)fVar59)) * 0.6931472 +
                           fVar170 +
                          (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) *
                                 fVar170 + -0.12420141) * fVar170 + 0.14249323) * fVar170 +
                              -0.16668057) * fVar170 + 0.20000714) * fVar170 + -0.24999994) *
                            fVar170 + 0.3333333) * fVar170 + -0.5) * fVar170 * fVar170) * -2.0);
              auVar99._12_4_ =
                   ~-(uint)(auVar98._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar120._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar178 < 0.70710677) & (uint)fVar60)) * 0.6931472 +
                           fVar179 +
                          (((((((((fVar179 * 0.070376836 + -0.1151461) * fVar179 + 0.116769984) *
                                 fVar179 + -0.12420141) * fVar179 + 0.14249323) * fVar179 +
                              -0.16668057) * fVar179 + 0.20000714) * fVar179 + -0.24999994) *
                            fVar179 + 0.3333333) * fVar179 + -0.5) * fVar179 * fVar179) * -2.0);
              auVar174._0_8_ =
                   CONCAT44(-(uint)(auVar98._4_4_ <= 0.0),-(uint)(auVar98._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar174._8_4_ = -(uint)(auVar98._8_4_ <= 0.0) & 0x7fffffff;
              auVar174._12_4_ = -(uint)(auVar98._12_4_ <= 0.0) & 0x7fffffff;
              auVar120 = minps(auVar174 | auVar99,_DAT_00595260);
              auVar120 = maxps(auVar120,_DAT_00595270);
              fVar169 = auVar120._0_4_ * 1.442695 + 0.5;
              fVar170 = auVar120._4_4_ * 1.442695 + 0.5;
              fVar178 = auVar120._8_4_ * 1.442695 + 0.5;
              fVar179 = auVar120._12_4_ * 1.442695 + 0.5;
              fVar176 = (float)(int)fVar169;
              fVar177 = (float)(int)fVar170;
              fVar159 = (float)(int)fVar178;
              fVar168 = (float)(int)fVar179;
              fVar176 = fVar176 - (float)(-(uint)(fVar169 < fVar176) & (uint)auVar106._0_4_);
              fVar177 = fVar177 - (float)(-(uint)(fVar170 < fVar177) & (uint)fVar58);
              fVar159 = fVar159 - (float)(-(uint)(fVar178 < fVar159) & (uint)fVar59);
              fVar168 = fVar168 - (float)(-(uint)(fVar179 < fVar168) & (uint)fVar60);
              fVar169 = auVar120._0_4_ - fVar176 * 0.6931472;
              fVar170 = auVar120._4_4_ - fVar177 * 0.6931472;
              fVar178 = auVar120._8_4_ - fVar159 * 0.6931472;
              fVar179 = auVar120._12_4_ - fVar168 * 0.6931472;
              auVar100._0_4_ = fVar169 * fVar169;
              auVar100._4_4_ = fVar170 * fVar170;
              auVar100._8_4_ = fVar178 * fVar178;
              auVar100._12_4_ = fVar179 * fVar179;
              fVar169 = (float)((int)fVar176 * 0x800000 + (int)auVar106._0_4_) *
                        (fVar169 + auVar106._0_4_ +
                        (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) *
                           fVar169 + 0.041665796) * fVar169 + 0.16666666) * fVar169 + 0.5) *
                        auVar100._0_4_) + auVar106._0_4_;
              fVar170 = (float)((int)fVar177 * 0x800000 + (int)fVar58) *
                        (fVar170 + fVar58 +
                        (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) *
                           fVar170 + 0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5) *
                        auVar100._4_4_) + fVar58;
              fVar178 = (float)((int)fVar159 * 0x800000 + (int)fVar59) *
                        (fVar178 + fVar59 +
                        (((((fVar178 * 0.00019875691 + 0.0013981999) * fVar178 + 0.008333452) *
                           fVar178 + 0.041665796) * fVar178 + 0.16666666) * fVar178 + 0.5) *
                        auVar100._8_4_) + fVar59;
              fVar179 = (float)((int)fVar168 * 0x800000 + (int)fVar60) *
                        (fVar179 + fVar60 +
                        (((((fVar179 * 0.00019875691 + 0.0013981999) * fVar179 + 0.008333452) *
                           fVar179 + 0.041665796) * fVar179 + 0.16666666) * fVar179 + 0.5) *
                        auVar100._12_4_) + fVar60;
              auVar167._4_4_ = fVar170;
              auVar167._0_4_ = fVar169;
              auVar167._8_4_ = fVar178;
              auVar167._12_4_ = fVar179;
              auVar120 = rcpps(auVar100,auVar167);
              fVar176 = auVar120._0_4_;
              fVar177 = auVar120._4_4_;
              fVar159 = auVar120._8_4_;
              fVar168 = auVar120._12_4_;
              auVar123._0_4_ =
                   fVar171 * (fVar176 + fVar176 + -1.0 +
                             (2.0 - fVar169 * (fVar176 + fVar176)) * fVar176);
              auVar123._4_4_ =
                   fVar175 * (fVar177 + fVar177 + -1.0 +
                             (2.0 - fVar170 * (fVar177 + fVar177)) * fVar177);
              auVar123._8_4_ =
                   auVar123._8_4_ *
                   (fVar159 + fVar159 + -1.0 + (2.0 - fVar178 * (fVar159 + fVar159)) * fVar159);
              auVar123._12_4_ =
                   auVar123._12_4_ *
                   (fVar168 + fVar168 + -1.0 + (2.0 - fVar179 * (fVar168 + fVar168)) * fVar168);
              break;
            case 6:
              fVar176 = **(float **)(&this->field_0xe8 + (long)p_Var13);
              fVar177 = (*(float **)(&this->field_0xe8 + (long)p_Var13))[1];
              auVar120._0_4_ = fVar176 * fVar171 + fVar177;
              auVar120._4_4_ = fVar176 * fVar175 + fVar177;
              auVar120._8_4_ = fVar176 * auVar123._8_4_ + fVar177;
              auVar120._12_4_ = fVar176 * auVar123._12_4_ + fVar177;
              auVar120 = maxps(auVar120,ZEXT816(0));
              auVar120 = minps(auVar120,auVar122);
              auVar123._0_4_ = fVar171 * auVar120._0_4_;
              auVar123._4_4_ = fVar175 * auVar120._4_4_;
              auVar123._8_4_ = auVar123._8_4_ * auVar120._8_4_;
              auVar123._12_4_ = auVar123._12_4_ * auVar120._12_4_;
            }
            *(undefined1 (*) [16])((long)top_blob->data + uVar44 * 0x10) = auVar123;
            uVar44 = uVar44 + 1;
            lVar50 = lVar50 + lVar37;
            lVar48 = lVar48 + lVar37;
            lVar49 = lVar49 + lVar37;
            lVar46 = lVar46 + lVar37;
          } while (uVar44 != (uint)((int)uVar34 >> 2));
        }
        uVar44 = (long)(int)uVar34 & 0xfffffffffffffffc;
        iVar30 = 0;
        if ((uint)uVar44 != uVar34) {
          pvVar11 = (this->weight_data_tm).data;
          pfVar42 = *(float **)(&this->field_0xe8 + (long)p_Var13);
          pvVar14 = top_blob->data;
          local_128 = uVar43 & 0xfffffffc;
          do {
            auVar106._0_4_ = 0.0;
            if (lVar10 != 0) {
              auVar106._0_4_ = *(float *)(lVar10 + uVar44 * 4);
            }
            pfVar51 = (float *)((long)pvVar11 + uVar44 * lVar39 * 4);
            pfVar36 = pfVar40;
            if ((int)uVar43 < 4) {
              fVar58 = 0.0;
              fVar59 = 0.0;
              fVar60 = 0.0;
              fVar171 = 0.0;
              uVar47 = 0;
            }
            else {
              fVar58 = 0.0;
              fVar59 = 0.0;
              fVar60 = 0.0;
              fVar171 = 0.0;
              iVar30 = 3;
              do {
                fVar58 = fVar58 + *pfVar51 * *pfVar36;
                fVar59 = fVar59 + pfVar51[1] * pfVar36[1];
                fVar60 = fVar60 + pfVar51[2] * pfVar36[2];
                fVar171 = fVar171 + pfVar51[3] * pfVar36[3];
                pfVar36 = pfVar36 + 4;
                pfVar51 = pfVar51 + 4;
                iVar30 = iVar30 + 4;
                uVar47 = local_128;
              } while (iVar30 < (int)uVar43);
            }
            if (uVar43 - uVar47 != 0 && (int)uVar47 <= (int)uVar43) {
              lVar46 = 0;
              do {
                auVar106._0_4_ = auVar106._0_4_ + pfVar51[lVar46] * pfVar36[lVar46];
                lVar46 = lVar46 + 1;
              } while (uVar43 - uVar47 != (int)lVar46);
            }
            auVar106._0_4_ = fVar171 + fVar59 + fVar60 + fVar58 + auVar106._0_4_;
            fVar58 = auVar106._0_4_;
            switch(uVar6) {
            case 1:
              if (auVar106._0_4_ <= 0.0) {
                fVar58 = 0.0;
              }
              break;
            case 2:
              fVar58 = (float)(~-(uint)(0.0 < auVar106._0_4_) & (uint)*pfVar42 |
                              -(uint)(0.0 < auVar106._0_4_) & 0x3f800000) * auVar106._0_4_;
              break;
            case 3:
              if (auVar106._0_4_ <= *pfVar42) {
                auVar106._0_4_ = *pfVar42;
              }
              fVar58 = pfVar42[1];
              if (auVar106._0_4_ <= pfVar42[1]) {
                fVar58 = auVar106._0_4_;
              }
              break;
            case 4:
              if (88.37626 <= auVar106._0_4_) {
                auVar106._0_4_ = 88.37626;
              }
              auVar106._0_4_ =
                   expf((float)(-(uint)(auVar106._0_4_ < -88.37626) & 0x42b0c0a5 |
                               ~-(uint)(auVar106._0_4_ < -88.37626) & (uint)-auVar106._0_4_));
              fVar58 = 1.0 / (auVar106._0_4_ + 1.0);
              break;
            case 5:
              fVar58 = expf(auVar106._0_4_);
              fVar58 = logf(fVar58 + 1.0);
              fVar58 = tanhf(fVar58);
              fVar58 = fVar58 * auVar106._0_4_;
              break;
            case 6:
              fVar59 = *pfVar42;
              fVar60 = -pfVar42[1] / fVar59;
              fVar58 = 0.0;
              if ((fVar60 <= auVar106._0_4_) &&
                 (fVar58 = auVar106._0_4_, auVar106._0_4_ <= fVar60 + 1.0 / fVar59)) {
                fVar58 = (fVar59 * auVar106._0_4_ + pfVar42[1]) * auVar106._0_4_;
              }
            }
            *(float *)((long)pvVar14 + uVar44 * 4) = fVar58;
            uVar44 = uVar44 + 1;
          } while ((long)uVar44 < (long)(int)uVar34);
          iVar30 = 0;
        }
      }
      else if (top_blob->elempack == 4) {
        if (0 < (int)uVar34) {
          uVar44 = 0;
          do {
            fVar171 = 0.0;
            fVar175 = 0.0;
            fVar176 = 0.0;
            fVar177 = 0.0;
            if (lVar10 != 0) {
              pfVar40 = (float *)(lVar10 + uVar44 * 0x10);
              fVar171 = *pfVar40;
              fVar175 = pfVar40[1];
              fVar176 = pfVar40[2];
              fVar177 = pfVar40[3];
            }
            pfVar42 = (float *)((long)(this->weight_data_tm).w * uVar44 *
                                (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data)
            ;
            pfVar40 = local_e8;
            if ((int)uVar43 < 4) {
              fVar178 = 0.0;
              fVar179 = 0.0;
              fVar180 = 0.0;
              fVar181 = 0.0;
              fVar159 = 0.0;
              fVar168 = 0.0;
              fVar169 = 0.0;
              fVar170 = 0.0;
              fVar182 = 0.0;
              fVar184 = 0.0;
              fVar186 = 0.0;
              fVar188 = 0.0;
              uVar47 = 0;
            }
            else {
              fVar182 = 0.0;
              fVar184 = 0.0;
              fVar186 = 0.0;
              fVar188 = 0.0;
              iVar30 = 3;
              fVar159 = 0.0;
              fVar168 = 0.0;
              fVar169 = 0.0;
              fVar170 = 0.0;
              fVar178 = 0.0;
              fVar179 = 0.0;
              fVar180 = 0.0;
              fVar181 = 0.0;
              do {
                fVar183 = *pfVar40;
                fVar185 = pfVar40[1];
                fVar187 = pfVar40[2];
                fVar189 = pfVar40[3];
                fVar171 = fVar171 + *pfVar42 * fVar183;
                fVar175 = fVar175 + pfVar42[1] * fVar183;
                fVar176 = fVar176 + pfVar42[2] * fVar183;
                fVar177 = fVar177 + pfVar42[3] * fVar183;
                fVar182 = fVar182 + pfVar42[4] * fVar185;
                fVar184 = fVar184 + pfVar42[5] * fVar185;
                fVar186 = fVar186 + pfVar42[6] * fVar185;
                fVar188 = fVar188 + pfVar42[7] * fVar185;
                fVar159 = fVar159 + pfVar42[8] * fVar187;
                fVar168 = fVar168 + pfVar42[9] * fVar187;
                fVar169 = fVar169 + pfVar42[10] * fVar187;
                fVar170 = fVar170 + pfVar42[0xb] * fVar187;
                fVar178 = fVar178 + pfVar42[0xc] * fVar189;
                fVar179 = fVar179 + pfVar42[0xd] * fVar189;
                fVar180 = fVar180 + pfVar42[0xe] * fVar189;
                fVar181 = fVar181 + pfVar42[0xf] * fVar189;
                pfVar40 = pfVar40 + 4;
                pfVar42 = pfVar42 + 0x10;
                iVar30 = iVar30 + 4;
                uVar47 = uVar43 & 0xfffffffc;
              } while (iVar30 < (int)uVar43);
            }
            if (uVar43 - uVar47 != 0 && (int)uVar47 <= (int)uVar43) {
              lVar39 = 0;
              do {
                fVar183 = pfVar40[lVar39];
                fVar171 = fVar171 + *pfVar42 * fVar183;
                fVar175 = fVar175 + pfVar42[1] * fVar183;
                fVar176 = fVar176 + pfVar42[2] * fVar183;
                fVar177 = fVar177 + pfVar42[3] * fVar183;
                pfVar42 = pfVar42 + 4;
                lVar39 = lVar39 + 1;
              } while (uVar43 - uVar47 != (int)lVar39);
            }
            fVar171 = fVar159 + fVar178 + fVar182 + fVar171;
            fVar175 = fVar168 + fVar179 + fVar184 + fVar175;
            auVar164._0_8_ = CONCAT44(fVar175,fVar171);
            auVar164._8_4_ = fVar169 + fVar180 + fVar186 + fVar176;
            auVar164._12_4_ = fVar170 + fVar181 + fVar188 + fVar177;
            switch(uVar6) {
            case 1:
              auVar164 = maxps(auVar164,ZEXT816(0));
              break;
            case 2:
              auVar96._8_4_ = auVar164._8_4_;
              auVar96._0_8_ = auVar164._0_8_;
              auVar96._12_4_ = auVar164._12_4_;
              auVar123 = maxps(auVar96,ZEXT816(0));
              auVar120 = minps(auVar164,ZEXT816(0));
              fVar171 = **(float **)(&this->field_0xe8 + (long)p_Var13);
              auVar164._4_4_ = fVar171 * auVar120._4_4_ + auVar123._4_4_;
              auVar164._0_4_ = fVar171 * auVar120._0_4_ + auVar123._0_4_;
              auVar164._8_4_ = fVar171 * auVar120._8_4_ + auVar123._8_4_;
              auVar164._12_4_ = fVar171 * auVar120._12_4_ + auVar123._12_4_;
              break;
            case 3:
              uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var13);
              uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var13))[1];
              auVar94._4_4_ = uVar5;
              auVar94._0_4_ = uVar5;
              auVar94._8_4_ = uVar5;
              auVar94._12_4_ = uVar5;
              auVar112._4_4_ = uVar7;
              auVar112._0_4_ = uVar7;
              auVar112._8_4_ = uVar7;
              auVar112._12_4_ = uVar7;
              auVar123 = maxps(auVar164,auVar94);
              auVar164 = minps(auVar123,auVar112);
              break;
            case 4:
              auVar165._0_8_ = CONCAT44(fVar175,fVar171) ^ 0x8000000080000000;
              auVar165._8_4_ = -auVar164._8_4_;
              auVar165._12_4_ = -auVar164._12_4_;
              auVar123 = minps(auVar165,_DAT_00595260);
              auVar123 = maxps(auVar123,_DAT_00595270);
              fVar175 = auVar123._0_4_ * 1.442695 + 0.5;
              fVar177 = auVar123._4_4_ * 1.442695 + 0.5;
              fVar168 = auVar123._8_4_ * 1.442695 + 0.5;
              fVar170 = auVar123._12_4_ * 1.442695 + 0.5;
              fVar171 = (float)(int)fVar175;
              fVar176 = (float)(int)fVar177;
              fVar159 = (float)(int)fVar168;
              fVar169 = (float)(int)fVar170;
              fVar171 = fVar171 - (float)(-(uint)(fVar175 < fVar171) & (uint)auVar106._0_4_);
              fVar176 = fVar176 - (float)(-(uint)(fVar177 < fVar176) & (uint)fVar58);
              fVar159 = fVar159 - (float)(-(uint)(fVar168 < fVar159) & (uint)fVar59);
              fVar169 = fVar169 - (float)(-(uint)(fVar170 < fVar169) & (uint)fVar60);
              fVar175 = fVar171 * -0.6931472 + auVar123._0_4_;
              fVar177 = fVar176 * -0.6931472 + auVar123._4_4_;
              fVar168 = fVar159 * -0.6931472 + auVar123._8_4_;
              fVar170 = fVar169 * -0.6931472 + auVar123._12_4_;
              auVar95._0_4_ =
                   fVar175 + auVar106._0_4_ +
                   (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175 +
                     0.041665796) * fVar175 + 0.16666666) * fVar175 + 0.5) * fVar175 * fVar175;
              auVar95._4_4_ =
                   fVar177 + fVar58 +
                   (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177 +
                     0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
              auVar95._8_4_ =
                   fVar168 + fVar59 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168;
              auVar95._12_4_ =
                   fVar170 + fVar60 +
                   (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170 +
                     0.041665796) * fVar170 + 0.16666666) * fVar170 + 0.5) * fVar170 * fVar170;
              auVar113._0_4_ =
                   (float)((int)fVar171 * 0x800000 + (int)auVar106._0_4_) * auVar95._0_4_ +
                   auVar106._0_4_;
              auVar113._4_4_ =
                   (float)((int)fVar176 * 0x800000 + (int)fVar58) * auVar95._4_4_ + fVar58;
              auVar113._8_4_ =
                   (float)((int)fVar159 * 0x800000 + (int)fVar59) * auVar95._8_4_ + fVar59;
              auVar113._12_4_ =
                   (float)((int)fVar169 * 0x800000 + (int)fVar60) * auVar95._12_4_ + fVar60;
              auVar123 = rcpps(auVar95,auVar113);
              fVar171 = auVar123._0_4_;
              fVar175 = auVar123._4_4_;
              fVar176 = auVar123._8_4_;
              fVar177 = auVar123._12_4_;
              auVar164._0_4_ = (auVar106._0_4_ - auVar113._0_4_ * fVar171) * fVar171 + fVar171;
              auVar164._4_4_ = (fVar58 - auVar113._4_4_ * fVar175) * fVar175 + fVar175;
              auVar164._8_4_ = (fVar59 - auVar113._8_4_ * fVar176) * fVar176 + fVar176;
              auVar164._12_4_ = (fVar60 - auVar113._12_4_ * fVar177) * fVar177 + fVar177;
              break;
            case 5:
              auVar91._8_4_ = auVar164._8_4_;
              auVar91._0_8_ = auVar164._0_8_;
              auVar91._12_4_ = auVar164._12_4_;
              auVar123 = minps(auVar91,_DAT_00595260);
              auVar123 = maxps(auVar123,_DAT_00595270);
              fVar176 = auVar123._0_4_ * 1.442695 + 0.5;
              fVar177 = auVar123._4_4_ * 1.442695 + 0.5;
              fVar159 = auVar123._8_4_ * 1.442695 + 0.5;
              fVar168 = auVar123._12_4_ * 1.442695 + 0.5;
              fVar169 = (float)(int)fVar176;
              fVar170 = (float)(int)fVar177;
              fVar178 = (float)(int)fVar159;
              fVar179 = (float)(int)fVar168;
              fVar169 = fVar169 - (float)(-(uint)(fVar176 < fVar169) & (uint)auVar106._0_4_);
              fVar170 = fVar170 - (float)(-(uint)(fVar177 < fVar170) & (uint)fVar58);
              fVar178 = fVar178 - (float)(-(uint)(fVar159 < fVar178) & (uint)fVar59);
              fVar179 = fVar179 - (float)(-(uint)(fVar168 < fVar179) & (uint)fVar60);
              fVar176 = auVar123._0_4_ - fVar169 * 0.6931472;
              fVar177 = auVar123._4_4_ - fVar170 * 0.6931472;
              fVar159 = auVar123._8_4_ - fVar178 * 0.6931472;
              fVar168 = auVar123._12_4_ - fVar179 * 0.6931472;
              auVar172._0_4_ =
                   (float)((int)fVar169 * 0x800000 + (int)auVar106._0_4_) *
                   (fVar176 + auVar106._0_4_ +
                   (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176 +
                     0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176) +
                   auVar106._0_4_;
              auVar172._4_4_ =
                   (float)((int)fVar170 * 0x800000 + (int)fVar58) *
                   (fVar177 + fVar58 +
                   (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177 +
                     0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177) +
                   fVar58;
              auVar172._8_4_ =
                   (float)((int)fVar178 * 0x800000 + (int)fVar59) *
                   (fVar159 + fVar59 +
                   (((((fVar159 * 0.00019875691 + 0.0013981999) * fVar159 + 0.008333452) * fVar159 +
                     0.041665796) * fVar159 + 0.16666666) * fVar159 + 0.5) * fVar159 * fVar159) +
                   fVar59;
              auVar172._12_4_ =
                   (float)((int)fVar179 * 0x800000 + (int)fVar60) *
                   (fVar168 + fVar60 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168) +
                   fVar60;
              auVar123 = maxps(auVar172,_DAT_00595310);
              fVar176 = (float)(auVar123._0_4_ & 0x807fffff | 0x3f000000);
              fVar159 = (float)(auVar123._4_4_ & 0x807fffff | 0x3f000000);
              fVar169 = (float)(auVar123._8_4_ & 0x807fffff | 0x3f000000);
              fVar178 = (float)(auVar123._12_4_ & 0x807fffff | 0x3f000000);
              fVar177 = fVar176 + -1.0 + (float)(-(uint)(fVar176 < 0.70710677) & (uint)fVar176);
              fVar168 = fVar159 + -1.0 + (float)(-(uint)(fVar159 < 0.70710677) & (uint)fVar159);
              fVar170 = fVar169 + -1.0 + (float)(-(uint)(fVar169 < 0.70710677) & (uint)fVar169);
              fVar179 = fVar178 + -1.0 + (float)(-(uint)(fVar178 < 0.70710677) & (uint)fVar178);
              auVar111._0_4_ =
                   ~-(uint)(auVar172._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar123._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar176 < 0.70710677) & (uint)auVar106._0_4_)) *
                           0.6931472 + fVar177 +
                          (((((((((fVar177 * 0.070376836 + -0.1151461) * fVar177 + 0.116769984) *
                                 fVar177 + -0.12420141) * fVar177 + 0.14249323) * fVar177 +
                              -0.16668057) * fVar177 + 0.20000714) * fVar177 + -0.24999994) *
                            fVar177 + 0.3333333) * fVar177 + -0.5) * fVar177 * fVar177) * -2.0);
              auVar111._4_4_ =
                   ~-(uint)(auVar172._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar123._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar159 < 0.70710677) & (uint)fVar58)) * 0.6931472 +
                           fVar168 +
                          (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                                 fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 +
                              -0.16668057) * fVar168 + 0.20000714) * fVar168 + -0.24999994) *
                            fVar168 + 0.3333333) * fVar168 + -0.5) * fVar168 * fVar168) * -2.0);
              auVar111._8_4_ =
                   ~-(uint)(auVar172._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar123._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar169 < 0.70710677) & (uint)fVar59)) * 0.6931472 +
                           fVar170 +
                          (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) *
                                 fVar170 + -0.12420141) * fVar170 + 0.14249323) * fVar170 +
                              -0.16668057) * fVar170 + 0.20000714) * fVar170 + -0.24999994) *
                            fVar170 + 0.3333333) * fVar170 + -0.5) * fVar170 * fVar170) * -2.0);
              auVar111._12_4_ =
                   ~-(uint)(auVar172._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar123._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar178 < 0.70710677) & (uint)fVar60)) * 0.6931472 +
                           fVar179 +
                          (((((((((fVar179 * 0.070376836 + -0.1151461) * fVar179 + 0.116769984) *
                                 fVar179 + -0.12420141) * fVar179 + 0.14249323) * fVar179 +
                              -0.16668057) * fVar179 + 0.20000714) * fVar179 + -0.24999994) *
                            fVar179 + 0.3333333) * fVar179 + -0.5) * fVar179 * fVar179) * -2.0);
              auVar92._0_8_ =
                   CONCAT44(-(uint)(auVar172._4_4_ <= 0.0),-(uint)(auVar172._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar92._8_4_ = -(uint)(auVar172._8_4_ <= 0.0) & 0x7fffffff;
              auVar92._12_4_ = -(uint)(auVar172._12_4_ <= 0.0) & 0x7fffffff;
              auVar123 = minps(auVar92 | auVar111,_DAT_00595260);
              auVar123 = maxps(auVar123,_DAT_00595270);
              fVar176 = auVar123._0_4_ * 1.442695 + 0.5;
              fVar177 = auVar123._4_4_ * 1.442695 + 0.5;
              fVar159 = auVar123._8_4_ * 1.442695 + 0.5;
              fVar168 = auVar123._12_4_ * 1.442695 + 0.5;
              fVar169 = (float)(int)fVar176;
              fVar170 = (float)(int)fVar177;
              fVar178 = (float)(int)fVar159;
              fVar179 = (float)(int)fVar168;
              fVar169 = fVar169 - (float)(-(uint)(fVar176 < fVar169) & (uint)auVar106._0_4_);
              fVar170 = fVar170 - (float)(-(uint)(fVar177 < fVar170) & (uint)fVar58);
              fVar178 = fVar178 - (float)(-(uint)(fVar159 < fVar178) & (uint)fVar59);
              fVar179 = fVar179 - (float)(-(uint)(fVar168 < fVar179) & (uint)fVar60);
              fVar176 = auVar123._0_4_ - fVar169 * 0.6931472;
              fVar177 = auVar123._4_4_ - fVar170 * 0.6931472;
              fVar159 = auVar123._8_4_ - fVar178 * 0.6931472;
              fVar168 = auVar123._12_4_ - fVar179 * 0.6931472;
              auVar93._0_4_ =
                   fVar176 + auVar106._0_4_ +
                   (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176 +
                     0.041665796) * fVar176 + 0.16666666) * fVar176 + 0.5) * fVar176 * fVar176;
              auVar93._4_4_ =
                   fVar177 + fVar58 +
                   (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177 +
                     0.041665796) * fVar177 + 0.16666666) * fVar177 + 0.5) * fVar177 * fVar177;
              auVar93._8_4_ =
                   fVar159 + fVar59 +
                   (((((fVar159 * 0.00019875691 + 0.0013981999) * fVar159 + 0.008333452) * fVar159 +
                     0.041665796) * fVar159 + 0.16666666) * fVar159 + 0.5) * fVar159 * fVar159;
              auVar93._12_4_ =
                   fVar168 + fVar60 +
                   (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168 +
                     0.041665796) * fVar168 + 0.16666666) * fVar168 + 0.5) * fVar168 * fVar168;
              fVar169 = (float)((int)fVar169 * 0x800000 + (int)auVar106._0_4_) * auVar93._0_4_ +
                        auVar106._0_4_;
              fVar170 = (float)((int)fVar170 * 0x800000 + (int)fVar58) * auVar93._4_4_ + fVar58;
              fVar178 = (float)((int)fVar178 * 0x800000 + (int)fVar59) * auVar93._8_4_ + fVar59;
              fVar179 = (float)((int)fVar179 * 0x800000 + (int)fVar60) * auVar93._12_4_ + fVar60;
              auVar21._4_4_ = fVar170;
              auVar21._0_4_ = fVar169;
              auVar21._8_4_ = fVar178;
              auVar21._12_4_ = fVar179;
              auVar123 = rcpps(auVar93,auVar21);
              fVar176 = auVar123._0_4_;
              fVar177 = auVar123._4_4_;
              fVar159 = auVar123._8_4_;
              fVar168 = auVar123._12_4_;
              auVar164._0_4_ =
                   fVar171 * (fVar176 + fVar176 + -1.0 +
                             (2.0 - fVar169 * (fVar176 + fVar176)) * fVar176);
              auVar164._4_4_ =
                   fVar175 * (fVar177 + fVar177 + -1.0 +
                             (2.0 - fVar170 * (fVar177 + fVar177)) * fVar177);
              auVar164._8_4_ =
                   auVar164._8_4_ *
                   (fVar159 + fVar159 + -1.0 + (2.0 - fVar178 * (fVar159 + fVar159)) * fVar159);
              auVar164._12_4_ =
                   auVar164._12_4_ *
                   (fVar168 + fVar168 + -1.0 + (2.0 - fVar179 * (fVar168 + fVar168)) * fVar168);
              break;
            case 6:
              fVar176 = **(float **)(&this->field_0xe8 + (long)p_Var13);
              fVar177 = (*(float **)(&this->field_0xe8 + (long)p_Var13))[1];
              auVar97._0_4_ = fVar176 * fVar171 + fVar177;
              auVar97._4_4_ = fVar176 * fVar175 + fVar177;
              auVar97._8_4_ = fVar176 * auVar164._8_4_ + fVar177;
              auVar97._12_4_ = fVar176 * auVar164._12_4_ + fVar177;
              auVar123 = maxps(auVar97,ZEXT816(0));
              auVar123 = minps(auVar123,auVar122);
              auVar164._0_4_ = fVar171 * auVar123._0_4_;
              auVar164._4_4_ = fVar175 * auVar123._4_4_;
              auVar164._8_4_ = auVar164._8_4_ * auVar123._8_4_;
              auVar164._12_4_ = auVar164._12_4_ * auVar123._12_4_;
            }
            *(undefined1 (*) [16])((long)top_blob->data + uVar44 * 0x10) = auVar164;
            uVar44 = uVar44 + 1;
          } while (uVar44 != uVar34);
        }
        iVar30 = 0;
      }
    }
    piVar12 = (int *)CONCAT44(uStack_dc,uStack_e0);
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        if (local_c8 == (Allocator *)0x0) {
          if (local_e8 != (float *)0x0) {
            free(local_e8);
          }
        }
        else {
          (*local_c8->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar30;
}

Assistant:

int InnerProduct_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}